

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O3

void capnp::_::anon_unknown_133::
     genericCheckTestMessageAllZero<capnproto_test::capnp::test::TestAllTypes::Reader>
               (Reader reader)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined8 uVar69;
  CapTableReader *pCVar70;
  undefined8 uVar71;
  byte bVar72;
  undefined1 uVar73;
  undefined2 uVar74;
  SegmentReader *pSVar75;
  char *pcVar76;
  char cVar77;
  short sVar78;
  WirePointer *pWVar79;
  bool bVar80;
  undefined4 uVar81;
  undefined4 uVar82;
  undefined4 uVar83;
  float fVar84;
  double dVar85;
  Reader subReader;
  DebugComparison<bool,_bool> _kjCondition;
  bool local_d0;
  DebugExpression<bool> _kjCondition_9;
  undefined1 auStack_b7 [7];
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  bool local_90;
  DebugExpression<bool> _kjCondition_21;
  undefined1 auStack_87 [15];
  undefined1 auStack_84 [12];
  int local_70;
  undefined4 uStack_6c;
  StructPointerCount local_64;
  int local_60;
  undefined1 local_58 [8];
  undefined8 uStack_50;
  WirePointer *local_48;
  int local_40;
  char *local_38;
  
  uStack_50 = (SegmentReader *)local_58;
  if (reader._reader.dataSize == 0) {
    bVar72 = 0;
  }
  else {
    bVar72 = *reader._reader.data & 1;
  }
  _kjCondition._0_8_ = (ulong)CONCAT61(_kjCondition._2_6_,bVar72) << 8;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition._25_7_ = SUB87(_kjCondition.op.content.size_ >> 8,0);
  _kjCondition.result = (bool)(bVar72 ^ 1);
  _kjCondition.op.content.size_ = 5;
  if ((bVar72 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar2[0xf] = 0;
    auVar2._0_15_ = (undefined1  [15])subReader._reader._1_15_;
    subReader._reader._0_16_ = auVar2 << 8;
    if (reader._reader.dataSize == 0) {
      bVar72 = 0;
    }
    else {
      bVar72 = *reader._reader.data & 1;
    }
    _kjCondition_9.value = (bool)bVar72;
    kj::_::Debug::log<char_const(&)[52],kj::_::DebugComparison<bool,bool>&,bool,bool>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1c5,ERROR,
               "\"failed: expected \" \"(false) == (reader.getBoolField())\", _kjCondition, false, reader.getBoolField()"
               ,(char (*) [52])"failed: expected (false) == (reader.getBoolField())",&_kjCondition,
               (bool *)&subReader,&_kjCondition_9.value);
  }
  if (reader._reader.dataSize < 0x10) {
    cVar77 = '\0';
  }
  else {
    cVar77 = *(char *)((long)reader._reader.data + 1);
  }
  _kjCondition._0_8_ = (ulong)CONCAT31(_kjCondition._5_3_,cVar77) << 0x20;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.result = cVar77 == '\0';
  _kjCondition.op.content.size_ = 5;
  if ((cVar77 != '\0') && (kj::_::Debug::minSeverity < 3)) {
    auVar3._12_4_ = 0;
    auVar3._0_12_ = (undefined1  [12])subReader._reader._4_12_;
    subReader._reader._0_16_ = auVar3 << 0x20;
    if (reader._reader.dataSize < 0x10) {
      uVar73 = 0;
    }
    else {
      uVar73 = *(undefined1 *)((long)reader._reader.data + 1);
    }
    _kjCondition_9.value = (bool)uVar73;
    kj::_::Debug::log<char_const(&)[48],kj::_::DebugComparison<int,signed_char>&,int,signed_char>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1c6,ERROR,
               "\"failed: expected \" \"(0) == (reader.getInt8Field())\", _kjCondition, 0, reader.getInt8Field()"
               ,(char (*) [48])"failed: expected (0) == (reader.getInt8Field())",
               (DebugComparison<int,_signed_char> *)&_kjCondition,(int *)&subReader,
               &_kjCondition_9.value);
  }
  if (reader._reader.dataSize < 0x20) {
    sVar78 = 0;
  }
  else {
    sVar78 = *(short *)((long)reader._reader.data + 2);
  }
  _kjCondition._0_8_ = (ulong)CONCAT22(_kjCondition._6_2_,sVar78) << 0x20;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.result = sVar78 == 0;
  _kjCondition.op.content.size_ = 5;
  if ((sVar78 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar4._12_4_ = 0;
    auVar4._0_12_ = (undefined1  [12])subReader._reader._4_12_;
    subReader._reader._0_16_ = auVar4 << 0x20;
    if (reader._reader.dataSize < 0x20) {
      uVar74 = 0;
    }
    else {
      uVar74 = *(undefined2 *)((long)reader._reader.data + 2);
    }
    __kjCondition_9 = uVar74;
    kj::_::Debug::log<char_const(&)[49],kj::_::DebugComparison<int,short>&,int,short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1c7,ERROR,
               "\"failed: expected \" \"(0) == (reader.getInt16Field())\", _kjCondition, 0, reader.getInt16Field()"
               ,(char (*) [49])"failed: expected (0) == (reader.getInt16Field())",
               (DebugComparison<int,_short> *)&_kjCondition,(int *)&subReader,
               (short *)&_kjCondition_9);
  }
  _kjCondition._4_4_ = 0;
  if (0x3f < reader._reader.dataSize) {
    _kjCondition._4_4_ = *(int *)((long)reader._reader.data + 4);
  }
  _kjCondition.left = false;
  _kjCondition.right = false;
  _kjCondition._2_2_ = 0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.result = _kjCondition._4_4_ == 0;
  _kjCondition.op.content.size_ = 5;
  if ((_kjCondition._4_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    uVar81 = 0;
    auVar5._12_4_ = 0;
    auVar5._0_12_ = (undefined1  [12])subReader._reader._4_12_;
    subReader._reader._0_16_ = auVar5 << 0x20;
    if (0x3f < reader._reader.dataSize) {
      uVar81 = *(undefined4 *)((long)reader._reader.data + 4);
    }
    __kjCondition_9 = uVar81;
    kj::_::Debug::log<char_const(&)[49],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1c8,ERROR,
               "\"failed: expected \" \"(0) == (reader.getInt32Field())\", _kjCondition, 0, reader.getInt32Field()"
               ,(char (*) [49])"failed: expected (0) == (reader.getInt32Field())",
               (DebugComparison<int,_int> *)&_kjCondition,(int *)&subReader,(int *)&_kjCondition_9);
  }
  if (reader._reader.dataSize < 0x80) {
    _kjCondition.op.content.ptr = (char *)0x0;
  }
  else {
    _kjCondition.op.content.ptr = *(char **)((long)reader._reader.data + 8);
  }
  _kjCondition.left = false;
  _kjCondition.right = false;
  _kjCondition._2_2_ = 0;
  _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_a914;
  _kjCondition.result = true;
  _kjCondition._25_7_ = 0;
  uVar69._0_1_ = false;
  uVar69._1_7_ = 0;
  if ((_kjCondition.op.content.ptr != (char *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    auVar6._12_4_ = 0;
    auVar6._0_12_ = stack0xffffffffffffff4c;
    __kjCondition_9 = (ArrayPtr<const_unsigned_char>)(auVar6 << 0x20);
    if (reader._reader.dataSize < 0x80) {
      pSVar75 = (SegmentReader *)0x0;
    }
    else {
      pSVar75 = *(SegmentReader **)((long)reader._reader.data + 8);
    }
    subReader._reader.segment = pSVar75;
    kj::_::Debug::log<char_const(&)[49],kj::_::DebugComparison<int,long>&,int,long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1c9,ERROR,
               "\"failed: expected \" \"(0) == (reader.getInt64Field())\", _kjCondition, 0, reader.getInt64Field()"
               ,(char (*) [49])"failed: expected (0) == (reader.getInt64Field())",
               (DebugComparison<int,_long> *)&_kjCondition,(int *)&_kjCondition_9,(long *)&subReader
              );
    uVar69 = _kjCondition._24_8_;
  }
  _kjCondition._24_8_ = uVar69;
  if (reader._reader.dataSize < 0x88) {
    cVar77 = '\0';
  }
  else {
    cVar77 = *(char *)((long)reader._reader.data + 0x10);
  }
  _kjCondition._0_8_ = (ulong)CONCAT31(_kjCondition._5_3_,cVar77) << 0x20;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.result = cVar77 == '\0';
  _kjCondition.op.content.size_ = 5;
  if ((cVar77 != '\0') && (kj::_::Debug::minSeverity < 3)) {
    auVar7._12_4_ = 0;
    auVar7._0_12_ = (undefined1  [12])subReader._reader._4_12_;
    subReader._reader._0_16_ = auVar7 << 0x20;
    if (reader._reader.dataSize < 0x88) {
      uVar73 = 0;
    }
    else {
      uVar73 = *(undefined1 *)((long)reader._reader.data + 0x10);
    }
    _kjCondition_9.value = (bool)uVar73;
    kj::_::Debug::
    log<char_const(&)[50],kj::_::DebugComparison<unsigned_int,unsigned_char>&,unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1ca,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getUInt8Field())\", _kjCondition, 0u, reader.getUInt8Field()"
               ,(char (*) [50])"failed: expected (0u) == (reader.getUInt8Field())",
               (DebugComparison<unsigned_int,_unsigned_char> *)&_kjCondition,(uint *)&subReader,
               &_kjCondition_9.value);
  }
  if (reader._reader.dataSize < 0xa0) {
    sVar78 = 0;
  }
  else {
    sVar78 = *(short *)((long)reader._reader.data + 0x12);
  }
  _kjCondition._0_8_ = (ulong)CONCAT22(_kjCondition._6_2_,sVar78) << 0x20;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.result = sVar78 == 0;
  _kjCondition.op.content.size_ = 5;
  if ((sVar78 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar8._12_4_ = 0;
    auVar8._0_12_ = (undefined1  [12])subReader._reader._4_12_;
    subReader._reader._0_16_ = auVar8 << 0x20;
    if (reader._reader.dataSize < 0xa0) {
      uVar74 = 0;
    }
    else {
      uVar74 = *(undefined2 *)((long)reader._reader.data + 0x12);
    }
    __kjCondition_9 = uVar74;
    kj::_::Debug::
    log<char_const(&)[51],kj::_::DebugComparison<unsigned_int,unsigned_short>&,unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1cb,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getUInt16Field())\", _kjCondition, 0u, reader.getUInt16Field()"
               ,(char (*) [51])"failed: expected (0u) == (reader.getUInt16Field())",
               (DebugComparison<unsigned_int,_unsigned_short> *)&_kjCondition,(uint *)&subReader,
               (unsigned_short *)&_kjCondition_9);
  }
  _kjCondition._4_4_ = 0;
  if (0xbf < reader._reader.dataSize) {
    _kjCondition._4_4_ = *(int *)((long)reader._reader.data + 0x14);
  }
  _kjCondition.left = false;
  _kjCondition.right = false;
  _kjCondition._2_2_ = 0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.result = _kjCondition._4_4_ == 0;
  _kjCondition.op.content.size_ = 5;
  if ((_kjCondition._4_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    uVar81 = 0;
    auVar9._12_4_ = 0;
    auVar9._0_12_ = (undefined1  [12])subReader._reader._4_12_;
    subReader._reader._0_16_ = auVar9 << 0x20;
    if (0xbf < reader._reader.dataSize) {
      uVar81 = *(undefined4 *)((long)reader._reader.data + 0x14);
    }
    __kjCondition_9 = uVar81;
    kj::_::Debug::
    log<char_const(&)[51],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1cc,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getUInt32Field())\", _kjCondition, 0u, reader.getUInt32Field()"
               ,(char (*) [51])"failed: expected (0u) == (reader.getUInt32Field())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition,(uint *)&subReader,
               (uint *)&_kjCondition_9);
  }
  if (reader._reader.dataSize < 0x100) {
    _kjCondition.op.content.ptr = (char *)0x0;
  }
  else {
    _kjCondition.op.content.ptr = *(char **)((long)reader._reader.data + 0x18);
  }
  _kjCondition.left = false;
  _kjCondition.right = false;
  _kjCondition._2_2_ = 0;
  _kjCondition._24_8_ = 5;
  _kjCondition.op.content.size_ = (size_t)" == ";
  if ((_kjCondition.op.content.ptr != (char *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    auVar10._12_4_ = 0;
    auVar10._0_12_ = stack0xffffffffffffff4c;
    __kjCondition_9 = (ArrayPtr<const_unsigned_char>)(auVar10 << 0x20);
    if (reader._reader.dataSize < 0x100) {
      pSVar75 = (SegmentReader *)0x0;
    }
    else {
      pSVar75 = *(SegmentReader **)((long)reader._reader.data + 0x18);
    }
    subReader._reader.segment = pSVar75;
    kj::_::Debug::
    log<char_const(&)[51],kj::_::DebugComparison<unsigned_int,unsigned_long>&,unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1cd,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getUInt64Field())\", _kjCondition, 0u, reader.getUInt64Field()"
               ,(char (*) [51])"failed: expected (0u) == (reader.getUInt64Field())",
               (DebugComparison<unsigned_int,_unsigned_long> *)&_kjCondition,(uint *)&_kjCondition_9
               ,(unsigned_long *)&subReader);
  }
  if (0x11f < reader._reader.dataSize) {
    _kjCondition._0_4_ = *(float *)((long)reader._reader.data + 0x20);
    if (((float)_kjCondition._0_4_ != 0.0) || (NAN((float)_kjCondition._0_4_))) {
      fVar84 = -(float)_kjCondition._0_4_;
      if (-(float)_kjCondition._0_4_ <= (float)_kjCondition._0_4_) {
        fVar84 = (float)_kjCondition._0_4_;
      }
      _kjCondition_9.value = fVar84 < fVar84 * 1e-05;
      if ((fVar84 * 1e-05 <= fVar84) && (kj::_::Debug::minSeverity < 3)) {
        auVar11._12_4_ = 0;
        auVar11._0_12_ = (undefined1  [12])subReader._reader._4_12_;
        subReader._reader._0_16_ = auVar11 << 0x20;
        kj::_::Debug::log<char_const(&)[72],kj::_::DebugExpression<bool>&,float,int>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x1ce,ERROR,
                   "\"failed: expected \" \"::kj::_::floatAlmostEqual(reader.getFloat32Field(), 0)\", _kjCondition, reader.getFloat32Field(), 0"
                   ,(char (*) [72])
                    "failed: expected ::kj::_::floatAlmostEqual(reader.getFloat32Field(), 0)",
                   &_kjCondition_9,(float *)&_kjCondition,(int *)&subReader);
      }
    }
  }
  pCVar70 = _uStack_b0;
  if (0x17f < reader._reader.dataSize) {
    _kjCondition._0_8_ = *(double *)((long)reader._reader.data + 0x28);
    if (((double)_kjCondition._0_8_ != 0.0) || (NAN((double)_kjCondition._0_8_))) {
      dVar85 = -(double)_kjCondition._0_8_;
      if (-(double)_kjCondition._0_8_ <= (double)_kjCondition._0_8_) {
        dVar85 = (double)_kjCondition._0_8_;
      }
      _kjCondition_9.value = dVar85 < dVar85 * 1e-12;
      if ((dVar85 * 1e-12 <= dVar85) && (kj::_::Debug::minSeverity < 3)) {
        auVar12._12_4_ = 0;
        auVar12._0_12_ = (undefined1  [12])subReader._reader._4_12_;
        subReader._reader._0_16_ = auVar12 << 0x20;
        kj::_::Debug::log<char_const(&)[73],kj::_::DebugExpression<bool>&,double,int>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x1cf,ERROR,
                   "\"failed: expected \" \"::kj::_::doubleAlmostEqual(reader.getFloat64Field(), 0)\", _kjCondition, reader.getFloat64Field(), 0"
                   ,(char (*) [73])
                    "failed: expected ::kj::_::doubleAlmostEqual(reader.getFloat64Field(), 0)",
                   &_kjCondition_9,(double *)&_kjCondition,(int *)&subReader);
        pCVar70 = _uStack_b0;
      }
    }
  }
  _uStack_b0 = pCVar70;
  __kjCondition_9 = (SegmentReader *)"";
  bVar80 = reader._reader.pointerCount == 0;
  _kjCondition.op.content.size_ = (size_t)reader._reader.pointers;
  if (bVar80) {
    _kjCondition.op.content.size_ = (size_t)(WirePointer *)0x0;
  }
  _kjCondition._24_4_ = 0x7fffffff;
  if (!bVar80) {
    _kjCondition._24_4_ = reader._reader.nestingLimit;
  }
  uVar81 = 0;
  _kjCondition._4_4_ = 0;
  uVar82 = 0;
  uVar83 = 0;
  if (!bVar80) {
    uVar81 = reader._reader.segment._0_4_;
    _kjCondition._4_4_ = reader._reader.segment._4_4_;
    uVar82 = reader._reader.capTable._0_4_;
    uVar83 = reader._reader.capTable._4_4_;
  }
  _kjCondition.left = (bool)(char)uVar81;
  _kjCondition.right = (bool)(char)((uint)uVar81 >> 8);
  _kjCondition._2_2_ = (short)((uint)uVar81 >> 0x10);
  _kjCondition.op.content.ptr = (char *)CONCAT44(uVar83,uVar82);
  subReader._reader._0_16_ =
       PointerReader::getBlob<capnp::Text>((PointerReader *)&_kjCondition,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[1]>::operator==
            ((DebugComparison<const_char_(&)[1],_capnp::Text::Reader> *)&_kjCondition,
             (DebugExpression<char_const(&)[1]> *)&_kjCondition_9,(Reader *)&subReader);
  if ((local_d0 == false) && (kj::_::Debug::minSeverity < 3)) {
    bVar80 = reader._reader.pointerCount == 0;
    subReader._reader.data = reader._reader.pointers;
    if (bVar80) {
      subReader._reader.data = (WirePointer *)0x0;
    }
    subReader._reader.pointers._0_4_ = 0x7fffffff;
    if (!bVar80) {
      subReader._reader.pointers._0_4_ = reader._reader.nestingLimit;
    }
    subReader._reader.segment._0_4_ = 0;
    subReader._reader.segment._4_4_ = 0;
    subReader._reader.capTable._0_4_ = 0;
    subReader._reader.capTable._4_4_ = 0;
    if (!bVar80) {
      subReader._reader.segment._0_4_ = reader._reader.segment._0_4_;
      subReader._reader.segment._4_4_ = reader._reader.segment._4_4_;
      subReader._reader.capTable._0_4_ = reader._reader.capTable._0_4_;
      subReader._reader.capTable._4_4_ = reader._reader.capTable._4_4_;
    }
    subReader._reader._0_16_ =
         PointerReader::getBlob<capnp::Text>((PointerReader *)&subReader,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[49],kj::_::DebugComparison<char_const(&)[1],capnp::Text::Reader>&,char_const(&)[1],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1d0,ERROR,
               "\"failed: expected \" \"(\\\"\\\") == (reader.getTextField())\", _kjCondition, \"\", reader.getTextField()"
               ,(char (*) [49])"failed: expected (\"\") == (reader.getTextField())",
               (DebugComparison<const_char_(&)[1],_capnp::Text::Reader> *)&_kjCondition,
               (char (*) [1])0x2fd09f,(Reader *)&subReader);
  }
  _kjCondition.op.content.size_ = (size_t)(reader._reader.pointers + 1);
  if (reader._reader.pointerCount < 2) {
    _kjCondition.op.content.size_ = (size_t)(WirePointer *)0x0;
  }
  uVar81 = reader._reader.segment._0_4_;
  _kjCondition._4_4_ = reader._reader.segment._4_4_;
  uVar82 = reader._reader.capTable._0_4_;
  uVar83 = reader._reader.capTable._4_4_;
  _kjCondition._24_4_ = reader._reader.nestingLimit;
  if (reader._reader.pointerCount < 2) {
    uVar81 = 0;
    _kjCondition._4_4_ = 0;
    uVar82 = 0;
    uVar83 = 0;
    _kjCondition._24_4_ = 0x7fffffff;
  }
  _kjCondition.left = (bool)(char)uVar81;
  _kjCondition.right = (bool)(char)((uint)uVar81 >> 8);
  _kjCondition._2_2_ = (short)((uint)uVar81 >> 0x10);
  _kjCondition.op.content.ptr = (char *)CONCAT44(uVar83,uVar82);
  _kjCondition._16_16_ =
       PointerReader::getBlob<capnp::Data>((PointerReader *)&_kjCondition,(void *)0x0,0);
  _kjCondition._0_8_ = (long)"\n\n" + 2;
  _kjCondition.op.content.ptr = (char *)0x0;
  if ((_kjCondition._24_8_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    __kjCondition_9 = (ArrayPtr<const_unsigned_char>)ZEXT816(0x2fd09f);
    subReader._reader.data = reader._reader.pointers + 1;
    if (reader._reader.pointerCount < 2) {
      subReader._reader.data = (WirePointer *)0x0;
    }
    subReader._reader.segment._0_4_ = reader._reader.segment._0_4_;
    subReader._reader.segment._4_4_ = reader._reader.segment._4_4_;
    subReader._reader.capTable._0_4_ = reader._reader.capTable._0_4_;
    subReader._reader.capTable._4_4_ = reader._reader.capTable._4_4_;
    subReader._reader.pointers._0_4_ = reader._reader.nestingLimit;
    if (reader._reader.pointerCount < 2) {
      subReader._reader.segment._0_4_ = 0;
      subReader._reader.segment._4_4_ = 0;
      subReader._reader.capTable._0_4_ = 0;
      subReader._reader.capTable._4_4_ = 0;
      subReader._reader.pointers._0_4_ = 0x7fffffff;
    }
    subReader._reader._0_16_ =
         PointerReader::getBlob<capnp::Data>((PointerReader *)&subReader,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[55],kj::_::DebugComparison<capnp::Data::Reader,capnp::Data::Reader>&,capnp::Data::Reader,capnp::Data::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1d1,ERROR,
               "\"failed: expected \" \"(data(\\\"\\\")) == (reader.getDataField())\", _kjCondition, data(\"\"), reader.getDataField()"
               ,(char (*) [55])"failed: expected (data(\"\")) == (reader.getDataField())",
               (DebugComparison<capnp::Data::Reader,_capnp::Data::Reader> *)&_kjCondition,
               (Reader *)&_kjCondition_9,(Reader *)&subReader);
  }
  pWVar79 = (WirePointer *)0x0;
  _kjCondition.op.content.size_ = (size_t)(reader._reader.pointers + 2);
  if (reader._reader.pointerCount < 3) {
    _kjCondition.op.content.size_ = (size_t)pWVar79;
  }
  uVar81 = reader._reader.segment._0_4_;
  _kjCondition._4_4_ = reader._reader.segment._4_4_;
  uVar82 = reader._reader.capTable._0_4_;
  uVar83 = reader._reader.capTable._4_4_;
  iVar1 = reader._reader.nestingLimit;
  if (reader._reader.pointerCount < 3) {
    uVar81 = 0;
    _kjCondition._4_4_ = 0;
    uVar82 = 0;
    uVar83 = 0;
    iVar1 = 0x7fffffff;
  }
  _kjCondition.left = (bool)(char)uVar81;
  _kjCondition.right = (bool)(char)((uint)uVar81 >> 8);
  _kjCondition._2_2_ = (short)((uint)uVar81 >> 0x10);
  _kjCondition.op.content.ptr = (char *)CONCAT44(uVar83,uVar82);
  _kjCondition._24_4_ = iVar1;
  PointerReader::getStruct(&subReader._reader,(PointerReader *)&_kjCondition,(word *)0x0);
  if (subReader._reader.dataSize != 0) {
    pWVar79 = (WirePointer *)((ulong)*subReader._reader.data & 0xffffffffffffff01);
  }
  bVar72 = (byte)pWVar79;
  _kjCondition._0_8_ = (ulong)CONCAT61(_kjCondition._2_6_,bVar72) << 8;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.result = (bool)(bVar72 ^ 1);
  _kjCondition.op.content.size_ = 5;
  if ((bVar72 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar13[0xf] = 0;
    auVar13._0_15_ = _auStack_b7;
    __kjCondition_9 = (ArrayPtr<const_unsigned_char>)(auVar13 << 8);
    if (subReader._reader.dataSize == 0) {
      bVar72 = 0;
    }
    else {
      bVar72 = *subReader._reader.data & 1;
    }
    _kjCondition_21.value = (bool)bVar72;
    kj::_::Debug::log<char_const(&)[55],kj::_::DebugComparison<bool,bool>&,bool,bool>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1d5,ERROR,
               "\"failed: expected \" \"(false) == (subReader.getBoolField())\", _kjCondition, false, subReader.getBoolField()"
               ,(char (*) [55])"failed: expected (false) == (subReader.getBoolField())",
               &_kjCondition,(bool *)&_kjCondition_9,&_kjCondition_21.value);
  }
  if (subReader._reader.dataSize < 0x10) {
    cVar77 = '\0';
  }
  else {
    cVar77 = *(char *)((long)subReader._reader.data + 1);
  }
  _kjCondition._0_8_ = (ulong)CONCAT31(_kjCondition._5_3_,cVar77) << 0x20;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.result = cVar77 == '\0';
  _kjCondition.op.content.size_ = 5;
  if ((cVar77 != '\0') && (kj::_::Debug::minSeverity < 3)) {
    auVar14._12_4_ = 0;
    auVar14._0_12_ = stack0xffffffffffffff4c;
    __kjCondition_9 = (ArrayPtr<const_unsigned_char>)(auVar14 << 0x20);
    if (subReader._reader.dataSize < 0x10) {
      uVar73 = 0;
    }
    else {
      uVar73 = *(undefined1 *)((long)subReader._reader.data + 1);
    }
    _kjCondition_21.value = (bool)uVar73;
    kj::_::Debug::log<char_const(&)[51],kj::_::DebugComparison<int,signed_char>&,int,signed_char>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1d6,ERROR,
               "\"failed: expected \" \"(0) == (subReader.getInt8Field())\", _kjCondition, 0, subReader.getInt8Field()"
               ,(char (*) [51])"failed: expected (0) == (subReader.getInt8Field())",
               (DebugComparison<int,_signed_char> *)&_kjCondition,(int *)&_kjCondition_9,
               &_kjCondition_21.value);
  }
  if (subReader._reader.dataSize < 0x20) {
    sVar78 = 0;
  }
  else {
    sVar78 = *(short *)((long)subReader._reader.data + 2);
  }
  _kjCondition._0_8_ = (ulong)CONCAT22(_kjCondition._6_2_,sVar78) << 0x20;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.result = sVar78 == 0;
  _kjCondition.op.content.size_ = 5;
  if ((sVar78 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar15._12_4_ = 0;
    auVar15._0_12_ = stack0xffffffffffffff4c;
    __kjCondition_9 = (ArrayPtr<const_unsigned_char>)(auVar15 << 0x20);
    if (subReader._reader.dataSize < 0x20) {
      uVar74 = 0;
    }
    else {
      uVar74 = *(undefined2 *)((long)subReader._reader.data + 2);
    }
    __kjCondition_21 = uVar74;
    kj::_::Debug::log<char_const(&)[52],kj::_::DebugComparison<int,short>&,int,short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1d7,ERROR,
               "\"failed: expected \" \"(0) == (subReader.getInt16Field())\", _kjCondition, 0, subReader.getInt16Field()"
               ,(char (*) [52])"failed: expected (0) == (subReader.getInt16Field())",
               (DebugComparison<int,_short> *)&_kjCondition,(int *)&_kjCondition_9,
               (short *)&_kjCondition_21);
  }
  _kjCondition._4_4_ = 0;
  if (0x3f < subReader._reader.dataSize) {
    _kjCondition._4_4_ = *(int *)((long)subReader._reader.data + 4);
  }
  _kjCondition.left = false;
  _kjCondition.right = false;
  _kjCondition._2_2_ = 0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.result = _kjCondition._4_4_ == 0;
  _kjCondition.op.content.size_ = 5;
  if ((_kjCondition._4_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    uVar81 = 0;
    auVar16._12_4_ = 0;
    auVar16._0_12_ = stack0xffffffffffffff4c;
    __kjCondition_9 = (ArrayPtr<const_unsigned_char>)(auVar16 << 0x20);
    if (0x3f < subReader._reader.dataSize) {
      uVar81 = *(undefined4 *)((long)subReader._reader.data + 4);
    }
    __kjCondition_21 = uVar81;
    kj::_::Debug::log<char_const(&)[52],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1d8,ERROR,
               "\"failed: expected \" \"(0) == (subReader.getInt32Field())\", _kjCondition, 0, subReader.getInt32Field()"
               ,(char (*) [52])"failed: expected (0) == (subReader.getInt32Field())",
               (DebugComparison<int,_int> *)&_kjCondition,(int *)&_kjCondition_9,
               (int *)&_kjCondition_21);
  }
  if (subReader._reader.dataSize < 0x80) {
    _kjCondition.op.content.ptr = (char *)0x0;
  }
  else {
    _kjCondition.op.content.ptr = *(char **)((long)subReader._reader.data + 8);
  }
  _kjCondition.left = false;
  _kjCondition.right = false;
  _kjCondition._2_2_ = 0;
  _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_a914;
  _kjCondition.result = true;
  _kjCondition._25_7_ = 0;
  uVar71._0_1_ = false;
  uVar71._1_7_ = 0;
  if ((_kjCondition.op.content.ptr != (char *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    auVar17._12_4_ = 0;
    auVar17._0_12_ = auStack_84;
    __kjCondition_21 = (ArrayPtr<const_char>)(auVar17 << 0x20);
    if (subReader._reader.dataSize < 0x80) {
      pcVar76 = (char *)0x0;
    }
    else {
      pcVar76 = *(char **)((long)subReader._reader.data + 8);
    }
    __kjCondition_9 = (SegmentReader *)pcVar76;
    kj::_::Debug::log<char_const(&)[52],kj::_::DebugComparison<int,long>&,int,long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1d9,ERROR,
               "\"failed: expected \" \"(0) == (subReader.getInt64Field())\", _kjCondition, 0, subReader.getInt64Field()"
               ,(char (*) [52])"failed: expected (0) == (subReader.getInt64Field())",
               (DebugComparison<int,_long> *)&_kjCondition,(int *)&_kjCondition_21,
               (long *)&_kjCondition_9);
    uVar71 = _kjCondition._24_8_;
  }
  _kjCondition._24_8_ = uVar71;
  if (subReader._reader.dataSize < 0x88) {
    cVar77 = '\0';
  }
  else {
    cVar77 = *(char *)((long)subReader._reader.data + 0x10);
  }
  _kjCondition._0_8_ = (ulong)CONCAT31(_kjCondition._5_3_,cVar77) << 0x20;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.result = cVar77 == '\0';
  _kjCondition.op.content.size_ = 5;
  if ((cVar77 != '\0') && (kj::_::Debug::minSeverity < 3)) {
    auVar18._12_4_ = 0;
    auVar18._0_12_ = stack0xffffffffffffff4c;
    __kjCondition_9 = (ArrayPtr<const_unsigned_char>)(auVar18 << 0x20);
    if (subReader._reader.dataSize < 0x88) {
      uVar73 = 0;
    }
    else {
      uVar73 = *(undefined1 *)((long)subReader._reader.data + 0x10);
    }
    _kjCondition_21.value = (bool)uVar73;
    kj::_::Debug::
    log<char_const(&)[53],kj::_::DebugComparison<unsigned_int,unsigned_char>&,unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1da,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getUInt8Field())\", _kjCondition, 0u, subReader.getUInt8Field()"
               ,(char (*) [53])"failed: expected (0u) == (subReader.getUInt8Field())",
               (DebugComparison<unsigned_int,_unsigned_char> *)&_kjCondition,(uint *)&_kjCondition_9
               ,&_kjCondition_21.value);
  }
  if (subReader._reader.dataSize < 0xa0) {
    sVar78 = 0;
  }
  else {
    sVar78 = *(short *)((long)subReader._reader.data + 0x12);
  }
  _kjCondition._0_8_ = (ulong)CONCAT22(_kjCondition._6_2_,sVar78) << 0x20;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.result = sVar78 == 0;
  _kjCondition.op.content.size_ = 5;
  if ((sVar78 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar19._12_4_ = 0;
    auVar19._0_12_ = stack0xffffffffffffff4c;
    __kjCondition_9 = (ArrayPtr<const_unsigned_char>)(auVar19 << 0x20);
    if (subReader._reader.dataSize < 0xa0) {
      uVar74 = 0;
    }
    else {
      uVar74 = *(undefined2 *)((long)subReader._reader.data + 0x12);
    }
    __kjCondition_21 = uVar74;
    kj::_::Debug::
    log<char_const(&)[54],kj::_::DebugComparison<unsigned_int,unsigned_short>&,unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1db,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getUInt16Field())\", _kjCondition, 0u, subReader.getUInt16Field()"
               ,(char (*) [54])"failed: expected (0u) == (subReader.getUInt16Field())",
               (DebugComparison<unsigned_int,_unsigned_short> *)&_kjCondition,
               (uint *)&_kjCondition_9,(unsigned_short *)&_kjCondition_21);
  }
  _kjCondition._4_4_ = 0;
  if (0xbf < subReader._reader.dataSize) {
    _kjCondition._4_4_ = *(int *)((long)subReader._reader.data + 0x14);
  }
  _kjCondition.left = false;
  _kjCondition.right = false;
  _kjCondition._2_2_ = 0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.result = _kjCondition._4_4_ == 0;
  _kjCondition.op.content.size_ = 5;
  if ((_kjCondition._4_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    uVar81 = 0;
    auVar20._12_4_ = 0;
    auVar20._0_12_ = stack0xffffffffffffff4c;
    __kjCondition_9 = (ArrayPtr<const_unsigned_char>)(auVar20 << 0x20);
    if (0xbf < subReader._reader.dataSize) {
      uVar81 = *(undefined4 *)((long)subReader._reader.data + 0x14);
    }
    __kjCondition_21 = uVar81;
    kj::_::Debug::
    log<char_const(&)[54],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1dc,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getUInt32Field())\", _kjCondition, 0u, subReader.getUInt32Field()"
               ,(char (*) [54])"failed: expected (0u) == (subReader.getUInt32Field())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition,(uint *)&_kjCondition_9,
               (uint *)&_kjCondition_21);
  }
  if (subReader._reader.dataSize < 0x100) {
    _kjCondition.op.content.ptr = (char *)0x0;
  }
  else {
    _kjCondition.op.content.ptr = *(char **)((long)subReader._reader.data + 0x18);
  }
  _kjCondition.left = false;
  _kjCondition.right = false;
  _kjCondition._2_2_ = 0;
  _kjCondition._24_8_ = 5;
  _kjCondition.op.content.size_ = (size_t)" == ";
  if ((_kjCondition.op.content.ptr != (char *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    auVar21._12_4_ = 0;
    auVar21._0_12_ = auStack_84;
    __kjCondition_21 = (ArrayPtr<const_char>)(auVar21 << 0x20);
    if (subReader._reader.dataSize < 0x100) {
      pcVar76 = (char *)0x0;
    }
    else {
      pcVar76 = *(char **)((long)subReader._reader.data + 0x18);
    }
    __kjCondition_9 = (SegmentReader *)pcVar76;
    kj::_::Debug::
    log<char_const(&)[54],kj::_::DebugComparison<unsigned_int,unsigned_long>&,unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1dd,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getUInt64Field())\", _kjCondition, 0u, subReader.getUInt64Field()"
               ,(char (*) [54])"failed: expected (0u) == (subReader.getUInt64Field())",
               (DebugComparison<unsigned_int,_unsigned_long> *)&_kjCondition,
               (uint *)&_kjCondition_21,(unsigned_long *)&_kjCondition_9);
  }
  if (0x11f < subReader._reader.dataSize) {
    _kjCondition._0_4_ = *(float *)((long)subReader._reader.data + 0x20);
    if (((float)_kjCondition._0_4_ != 0.0) || (NAN((float)_kjCondition._0_4_))) {
      fVar84 = -(float)_kjCondition._0_4_;
      if (-(float)_kjCondition._0_4_ <= (float)_kjCondition._0_4_) {
        fVar84 = (float)_kjCondition._0_4_;
      }
      _kjCondition_21.value = fVar84 < fVar84 * 1e-05;
      if ((fVar84 * 1e-05 <= fVar84) && (kj::_::Debug::minSeverity < 3)) {
        auVar22._12_4_ = 0;
        auVar22._0_12_ = stack0xffffffffffffff4c;
        __kjCondition_9 = (ArrayPtr<const_unsigned_char>)(auVar22 << 0x20);
        kj::_::Debug::log<char_const(&)[75],kj::_::DebugExpression<bool>&,float,int>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x1de,ERROR,
                   "\"failed: expected \" \"::kj::_::floatAlmostEqual(subReader.getFloat32Field(), 0)\", _kjCondition, subReader.getFloat32Field(), 0"
                   ,(char (*) [75])
                    "failed: expected ::kj::_::floatAlmostEqual(subReader.getFloat32Field(), 0)",
                   &_kjCondition_21,(float *)&_kjCondition,(int *)&_kjCondition_9);
      }
    }
  }
  uVar69 = auStack_84._4_8_;
  if (0x17f < subReader._reader.dataSize) {
    _kjCondition._0_8_ = *(double *)((long)subReader._reader.data + 0x28);
    if (((double)_kjCondition._0_8_ != 0.0) || (NAN((double)_kjCondition._0_8_))) {
      dVar85 = -(double)_kjCondition._0_8_;
      if (-(double)_kjCondition._0_8_ <= (double)_kjCondition._0_8_) {
        dVar85 = (double)_kjCondition._0_8_;
      }
      _kjCondition_21.value = dVar85 < dVar85 * 1e-12;
      if ((dVar85 * 1e-12 <= dVar85) && (kj::_::Debug::minSeverity < 3)) {
        auVar23._12_4_ = 0;
        auVar23._0_12_ = stack0xffffffffffffff4c;
        __kjCondition_9 = (ArrayPtr<const_unsigned_char>)(auVar23 << 0x20);
        kj::_::Debug::log<char_const(&)[76],kj::_::DebugExpression<bool>&,double,int>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x1df,ERROR,
                   "\"failed: expected \" \"::kj::_::doubleAlmostEqual(subReader.getFloat64Field(), 0)\", _kjCondition, subReader.getFloat64Field(), 0"
                   ,(char (*) [76])
                    "failed: expected ::kj::_::doubleAlmostEqual(subReader.getFloat64Field(), 0)",
                   &_kjCondition_21,(double *)&_kjCondition,(int *)&_kjCondition_9);
        uVar69 = auStack_84._4_8_;
      }
    }
  }
  auStack_84._4_8_ = uVar69;
  __kjCondition_21 = "";
  bVar80 = subReader._reader.pointerCount == 0;
  _kjCondition.op.content.size_ =
       CONCAT44(subReader._reader.pointers._4_4_,(int)subReader._reader.pointers);
  if (bVar80) {
    _kjCondition.op.content.size_ = 0;
  }
  _kjCondition._24_4_ = 0x7fffffff;
  if (!bVar80) {
    _kjCondition._24_4_ = subReader._reader.nestingLimit;
  }
  uVar81 = 0;
  _kjCondition._4_4_ = 0;
  uVar82 = 0;
  uVar83 = 0;
  if (!bVar80) {
    uVar81 = subReader._reader.segment._0_4_;
    _kjCondition._4_4_ = subReader._reader.segment._4_4_;
    uVar82 = subReader._reader.capTable._0_4_;
    uVar83 = subReader._reader.capTable._4_4_;
  }
  _kjCondition.left = (bool)(char)uVar81;
  _kjCondition.right = (bool)(char)((uint)uVar81 >> 8);
  _kjCondition._2_2_ = (short)((uint)uVar81 >> 0x10);
  _kjCondition.op.content.ptr = (char *)CONCAT44(uVar83,uVar82);
  __kjCondition_9 =
       (ArrayPtr<const_unsigned_char>)
       PointerReader::getBlob<capnp::Text>((PointerReader *)&_kjCondition,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[1]>::operator==
            ((DebugComparison<const_char_(&)[1],_capnp::Text::Reader> *)&_kjCondition,
             (DebugExpression<char_const(&)[1]> *)&_kjCondition_21,(Reader *)&_kjCondition_9);
  _kjCondition.op.content.size_ =
       CONCAT44(subReader._reader.pointers._4_4_,(int)subReader._reader.pointers) + 8;
  if (subReader._reader.pointerCount < 2) {
    _kjCondition.op.content.size_ = 0;
  }
  if (subReader._reader.pointerCount < 2) {
    uVar81 = 0;
    _kjCondition._4_4_ = 0;
    uVar82 = 0;
    uVar83 = 0;
    subReader._reader.nestingLimit = 0x7fffffff;
  }
  else {
    uVar81 = subReader._reader.segment._0_4_;
    _kjCondition._4_4_ = subReader._reader.segment._4_4_;
    uVar82 = subReader._reader.capTable._0_4_;
    uVar83 = subReader._reader.capTable._4_4_;
  }
  _kjCondition.left = (bool)(char)uVar81;
  _kjCondition.right = (bool)(char)((uint)uVar81 >> 8);
  _kjCondition._2_2_ = (short)((uint)uVar81 >> 0x10);
  _kjCondition.op.content.ptr = (char *)CONCAT44(uVar83,uVar82);
  _kjCondition._24_4_ = subReader._reader.nestingLimit;
  _kjCondition._16_16_ =
       PointerReader::getBlob<capnp::Data>((PointerReader *)&_kjCondition,(void *)0x0,0);
  _kjCondition._0_8_ = (long)"\n\n" + 2;
  _kjCondition.op.content.ptr = (char *)0x0;
  if ((_kjCondition._24_8_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    __kjCondition_21 = (ArrayPtr<const_char>)ZEXT816(0x2fd09f);
    if (subReader._reader.pointerCount < 2) {
      __kjCondition_9 = 0;
      auStack_b7._3_4_ = 0;
      uStack_b0 = 0;
      uStack_ac = 0;
    }
    else {
      __kjCondition_9 = subReader._reader.segment._0_4_;
      auStack_b7._3_4_ = subReader._reader.segment._4_4_;
      uStack_b0 = subReader._reader.capTable._0_4_;
      uStack_ac = subReader._reader.capTable._4_4_;
    }
    __kjCondition_9 =
         (ArrayPtr<const_unsigned_char>)
         PointerReader::getBlob<capnp::Data>((PointerReader *)&_kjCondition_9,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[58],kj::_::DebugComparison<capnp::Data::Reader,capnp::Data::Reader>&,capnp::Data::Reader,capnp::Data::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1e1,ERROR,
               "\"failed: expected \" \"(data(\\\"\\\")) == (subReader.getDataField())\", _kjCondition, data(\"\"), subReader.getDataField()"
               ,(char (*) [58])"failed: expected (data(\"\")) == (subReader.getDataField())",
               (DebugComparison<capnp::Data::Reader,_capnp::Data::Reader> *)&_kjCondition,
               (Reader *)&_kjCondition_21,(Reader *)&_kjCondition_9);
  }
  if (subReader._reader.pointerCount < 3) {
    __kjCondition_9 = 0;
    auStack_b7._3_4_ = 0;
    uStack_b0 = 0;
    uStack_ac = 0;
  }
  else {
    __kjCondition_9 = subReader._reader.segment._0_4_;
    auStack_b7._3_4_ = subReader._reader.segment._4_4_;
    uStack_b0 = subReader._reader.capTable._0_4_;
    uStack_ac = subReader._reader.capTable._4_4_;
  }
  PointerReader::getStruct
            ((StructReader *)&_kjCondition,(PointerReader *)&_kjCondition_9,(word *)0x0);
  local_58 = (undefined1  [8])"";
  __kjCondition_9 = (ArrayPtr<const_unsigned_char>)ZEXT816(0);
  __kjCondition_21 =
       (ArrayPtr<const_char>)
       PointerReader::getBlob<capnp::Text>((PointerReader *)&_kjCondition_9,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[1]>::operator==
            ((DebugComparison<const_char_(&)[1],_capnp::Text::Reader> *)&_kjCondition_9,
             (DebugExpression<char_const(&)[1]> *)local_58,(Reader *)&_kjCondition_21);
  if ((local_90 == false) && (kj::_::Debug::minSeverity < 3)) {
    local_70 = 0x7fffffff;
    __kjCondition_21 = (ArrayPtr<const_char>)ZEXT816(0);
    __kjCondition_21 =
         (ArrayPtr<const_char>)
         PointerReader::getBlob<capnp::Text>((PointerReader *)&_kjCondition_21,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[55],kj::_::DebugComparison<char_const(&)[1],capnp::Text::Reader>&,char_const(&)[1],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1e4,ERROR,
               "\"failed: expected \" \"(\\\"\\\") == (subSubReader.getTextField())\", _kjCondition, \"\", subSubReader.getTextField()"
               ,(char (*) [55])"failed: expected (\"\") == (subSubReader.getTextField())",
               (DebugComparison<const_char_(&)[1],_capnp::Text::Reader> *)&_kjCondition_9,
               (char (*) [1])0x2fd09f,(Reader *)&_kjCondition_21);
  }
  local_38 = "";
  __kjCondition_9 = (ArrayPtr<const_unsigned_char>)ZEXT816(0);
  PointerReader::getStruct
            ((StructReader *)&_kjCondition_21,(PointerReader *)&_kjCondition_9,(word *)0x0);
  __kjCondition_9 = 0;
  auStack_b7._3_4_ = 0;
  uStack_b0 = 0;
  uStack_ac = 0;
  if (local_64 != 0) {
    __kjCondition_9 = __kjCondition_21;
    auStack_b7._3_4_ = auStack_84._0_4_;
    uStack_b0 = auStack_84._4_4_;
    uStack_ac = auStack_84._8_4_;
  }
  _local_58 = (ArrayPtr<const_char>)
              PointerReader::getBlob<capnp::Text>((PointerReader *)&_kjCondition_9,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[1]>::operator==
            ((DebugComparison<const_char_(&)[1],_capnp::Text::Reader> *)&_kjCondition_9,
             (DebugExpression<char_const(&)[1]> *)&local_38,(Reader *)local_58);
  if ((local_90 == false) && (kj::_::Debug::minSeverity < 3)) {
    pWVar79 = (WirePointer *)0x0;
    local_48 = (WirePointer *)0x0;
    local_40 = 0x7fffffff;
    _local_58 = (ArrayPtr<const_char>)ZEXT816(0);
    PointerReader::getStruct((StructReader *)&_kjCondition_21,(PointerReader *)local_58,(word *)0x0)
    ;
    local_40 = 0x7fffffff;
    if (local_64 != 0) {
      pWVar79 = (WirePointer *)CONCAT44(uStack_6c,local_70);
      local_40 = local_60;
    }
    local_58._0_4_ = 0;
    local_58._4_4_ = 0;
    uStack_50._0_4_ = 0;
    uStack_50._4_4_ = 0;
    if (local_64 != 0) {
      local_58._0_4_ = __kjCondition_21;
      local_58._4_4_ = auStack_84._0_4_;
      uStack_50._0_4_ = auStack_84._4_4_;
      uStack_50._4_4_ = auStack_84._8_4_;
    }
    local_48 = pWVar79;
    _local_58 = (ArrayPtr<const_char>)
                PointerReader::getBlob<capnp::Text>((PointerReader *)local_58,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[72],kj::_::DebugComparison<char_const(&)[1],capnp::Text::Reader>&,char_const(&)[1],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1e5,ERROR,
               "\"failed: expected \" \"(\\\"\\\") == (subSubReader.getStructField().getTextField())\", _kjCondition, \"\", subSubReader.getStructField().getTextField()"
               ,(char (*) [72])
                "failed: expected (\"\") == (subSubReader.getStructField().getTextField())",
               (DebugComparison<const_char_(&)[1],_capnp::Text::Reader> *)&_kjCondition_9,
               (char (*) [1])0x2fd09f,(Reader *)local_58);
  }
  if (subReader._reader.pointerCount < 4) {
    __kjCondition_9 = 0;
    auStack_b7._3_4_ = 0;
    uStack_b0 = 0;
    uStack_ac = 0;
  }
  else {
    __kjCondition_9 = subReader._reader.segment._0_4_;
    auStack_b7._3_4_ = subReader._reader.segment._4_4_;
    uStack_b0 = subReader._reader.capTable._0_4_;
    uStack_ac = subReader._reader.capTable._4_4_;
  }
  PointerReader::getList
            ((ListReader *)&_kjCondition,(PointerReader *)&_kjCondition_9,VOID,(word *)0x0);
  auVar40._4_8_ = " == ";
  auVar40._0_4_ = _kjCondition._24_4_;
  auVar40._12_4_ = 0;
  __kjCondition_21 = (ArrayPtr<const_char>)(auVar40 << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar24._12_4_ = 0;
    auVar24._0_12_ = stack0xffffffffffffffac;
    _local_58 = (ArrayPtr<const_char>)(auVar24 << 0x20);
    if (subReader._reader.pointerCount < 4) {
      __kjCondition_9 = 0;
      auStack_b7._3_4_ = 0;
      uStack_b0 = 0;
      uStack_ac = 0;
    }
    else {
      __kjCondition_9 = subReader._reader.segment._0_4_;
      auStack_b7._3_4_ = subReader._reader.segment._4_4_;
      uStack_b0 = subReader._reader.capTable._0_4_;
      uStack_ac = subReader._reader.capTable._4_4_;
    }
    PointerReader::getList
              ((ListReader *)&_kjCondition,(PointerReader *)&_kjCondition_9,VOID,(word *)0x0);
    auVar2 = (undefined1  [16])_kjCondition._16_16_;
    _kjCondition_9.value = _kjCondition.result;
    auStack_b7._0_3_ = _kjCondition._25_3_;
    _kjCondition._16_16_ = auVar2;
    kj::_::Debug::
    log<char_const(&)[58],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1e8,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getVoidList().size())\", _kjCondition, 0u, subReader.getVoidList().size()"
               ,(char (*) [58])"failed: expected (0u) == (subReader.getVoidList().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_21,(uint *)local_58,
               (uint *)&_kjCondition_9);
  }
  if (subReader._reader.pointerCount < 5) {
    __kjCondition_9 = 0;
    auStack_b7._3_4_ = 0;
    uStack_b0 = 0;
    uStack_ac = 0;
  }
  else {
    __kjCondition_9 = subReader._reader.segment._0_4_;
    auStack_b7._3_4_ = subReader._reader.segment._4_4_;
    uStack_b0 = subReader._reader.capTable._0_4_;
    uStack_ac = subReader._reader.capTable._4_4_;
  }
  PointerReader::getList
            ((ListReader *)&_kjCondition,(PointerReader *)&_kjCondition_9,BIT,(word *)0x0);
  auVar41._4_8_ = " == ";
  auVar41._0_4_ = _kjCondition._24_4_;
  auVar41._12_4_ = 0;
  __kjCondition_21 = (ArrayPtr<const_char>)(auVar41 << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar25._12_4_ = 0;
    auVar25._0_12_ = stack0xffffffffffffffac;
    _local_58 = (ArrayPtr<const_char>)(auVar25 << 0x20);
    if (subReader._reader.pointerCount < 5) {
      __kjCondition_9 = 0;
      auStack_b7._3_4_ = 0;
      uStack_b0 = 0;
      uStack_ac = 0;
    }
    else {
      __kjCondition_9 = subReader._reader.segment._0_4_;
      auStack_b7._3_4_ = subReader._reader.segment._4_4_;
      uStack_b0 = subReader._reader.capTable._0_4_;
      uStack_ac = subReader._reader.capTable._4_4_;
    }
    PointerReader::getList
              ((ListReader *)&_kjCondition,(PointerReader *)&_kjCondition_9,BIT,(word *)0x0);
    auVar2 = (undefined1  [16])_kjCondition._16_16_;
    _kjCondition_9.value = _kjCondition.result;
    auStack_b7._0_3_ = _kjCondition._25_3_;
    _kjCondition._16_16_ = auVar2;
    kj::_::Debug::
    log<char_const(&)[58],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1e9,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getBoolList().size())\", _kjCondition, 0u, subReader.getBoolList().size()"
               ,(char (*) [58])"failed: expected (0u) == (subReader.getBoolList().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_21,(uint *)local_58,
               (uint *)&_kjCondition_9);
  }
  if (subReader._reader.pointerCount < 6) {
    __kjCondition_9 = 0;
    auStack_b7._3_4_ = 0;
    uStack_b0 = 0;
    uStack_ac = 0;
  }
  else {
    __kjCondition_9 = subReader._reader.segment._0_4_;
    auStack_b7._3_4_ = subReader._reader.segment._4_4_;
    uStack_b0 = subReader._reader.capTable._0_4_;
    uStack_ac = subReader._reader.capTable._4_4_;
  }
  PointerReader::getList
            ((ListReader *)&_kjCondition,(PointerReader *)&_kjCondition_9,BYTE,(word *)0x0);
  auVar42._4_8_ = " == ";
  auVar42._0_4_ = _kjCondition._24_4_;
  auVar42._12_4_ = 0;
  __kjCondition_21 = (ArrayPtr<const_char>)(auVar42 << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar26._12_4_ = 0;
    auVar26._0_12_ = stack0xffffffffffffffac;
    _local_58 = (ArrayPtr<const_char>)(auVar26 << 0x20);
    if (subReader._reader.pointerCount < 6) {
      __kjCondition_9 = 0;
      auStack_b7._3_4_ = 0;
      uStack_b0 = 0;
      uStack_ac = 0;
    }
    else {
      __kjCondition_9 = subReader._reader.segment._0_4_;
      auStack_b7._3_4_ = subReader._reader.segment._4_4_;
      uStack_b0 = subReader._reader.capTable._0_4_;
      uStack_ac = subReader._reader.capTable._4_4_;
    }
    PointerReader::getList
              ((ListReader *)&_kjCondition,(PointerReader *)&_kjCondition_9,BYTE,(word *)0x0);
    auVar2 = (undefined1  [16])_kjCondition._16_16_;
    _kjCondition_9.value = _kjCondition.result;
    auStack_b7._0_3_ = _kjCondition._25_3_;
    _kjCondition._16_16_ = auVar2;
    kj::_::Debug::
    log<char_const(&)[58],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1ea,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getInt8List().size())\", _kjCondition, 0u, subReader.getInt8List().size()"
               ,(char (*) [58])"failed: expected (0u) == (subReader.getInt8List().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_21,(uint *)local_58,
               (uint *)&_kjCondition_9);
  }
  if (subReader._reader.pointerCount < 7) {
    __kjCondition_9 = 0;
    auStack_b7._3_4_ = 0;
    uStack_b0 = 0;
    uStack_ac = 0;
  }
  else {
    __kjCondition_9 = subReader._reader.segment._0_4_;
    auStack_b7._3_4_ = subReader._reader.segment._4_4_;
    uStack_b0 = subReader._reader.capTable._0_4_;
    uStack_ac = subReader._reader.capTable._4_4_;
  }
  PointerReader::getList
            ((ListReader *)&_kjCondition,(PointerReader *)&_kjCondition_9,TWO_BYTES,(word *)0x0);
  auVar43._4_8_ = " == ";
  auVar43._0_4_ = _kjCondition._24_4_;
  auVar43._12_4_ = 0;
  __kjCondition_21 = (ArrayPtr<const_char>)(auVar43 << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar27._12_4_ = 0;
    auVar27._0_12_ = stack0xffffffffffffffac;
    _local_58 = (ArrayPtr<const_char>)(auVar27 << 0x20);
    if (subReader._reader.pointerCount < 7) {
      __kjCondition_9 = 0;
      auStack_b7._3_4_ = 0;
      uStack_b0 = 0;
      uStack_ac = 0;
    }
    else {
      __kjCondition_9 = subReader._reader.segment._0_4_;
      auStack_b7._3_4_ = subReader._reader.segment._4_4_;
      uStack_b0 = subReader._reader.capTable._0_4_;
      uStack_ac = subReader._reader.capTable._4_4_;
    }
    PointerReader::getList
              ((ListReader *)&_kjCondition,(PointerReader *)&_kjCondition_9,TWO_BYTES,(word *)0x0);
    auVar2 = (undefined1  [16])_kjCondition._16_16_;
    _kjCondition_9.value = _kjCondition.result;
    auStack_b7._0_3_ = _kjCondition._25_3_;
    _kjCondition._16_16_ = auVar2;
    kj::_::Debug::
    log<char_const(&)[59],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1eb,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getInt16List().size())\", _kjCondition, 0u, subReader.getInt16List().size()"
               ,(char (*) [59])"failed: expected (0u) == (subReader.getInt16List().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_21,(uint *)local_58,
               (uint *)&_kjCondition_9);
  }
  if (subReader._reader.pointerCount < 8) {
    __kjCondition_9 = 0;
    auStack_b7._3_4_ = 0;
    uStack_b0 = 0;
    uStack_ac = 0;
  }
  else {
    __kjCondition_9 = subReader._reader.segment._0_4_;
    auStack_b7._3_4_ = subReader._reader.segment._4_4_;
    uStack_b0 = subReader._reader.capTable._0_4_;
    uStack_ac = subReader._reader.capTable._4_4_;
  }
  PointerReader::getList
            ((ListReader *)&_kjCondition,(PointerReader *)&_kjCondition_9,FOUR_BYTES,(word *)0x0);
  auVar44._4_8_ = " == ";
  auVar44._0_4_ = _kjCondition._24_4_;
  auVar44._12_4_ = 0;
  __kjCondition_21 = (ArrayPtr<const_char>)(auVar44 << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar28._12_4_ = 0;
    auVar28._0_12_ = stack0xffffffffffffffac;
    _local_58 = (ArrayPtr<const_char>)(auVar28 << 0x20);
    if (subReader._reader.pointerCount < 8) {
      __kjCondition_9 = 0;
      auStack_b7._3_4_ = 0;
      uStack_b0 = 0;
      uStack_ac = 0;
    }
    else {
      __kjCondition_9 = subReader._reader.segment._0_4_;
      auStack_b7._3_4_ = subReader._reader.segment._4_4_;
      uStack_b0 = subReader._reader.capTable._0_4_;
      uStack_ac = subReader._reader.capTable._4_4_;
    }
    PointerReader::getList
              ((ListReader *)&_kjCondition,(PointerReader *)&_kjCondition_9,FOUR_BYTES,(word *)0x0);
    auVar2 = (undefined1  [16])_kjCondition._16_16_;
    _kjCondition_9.value = _kjCondition.result;
    auStack_b7._0_3_ = _kjCondition._25_3_;
    _kjCondition._16_16_ = auVar2;
    kj::_::Debug::
    log<char_const(&)[59],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1ec,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getInt32List().size())\", _kjCondition, 0u, subReader.getInt32List().size()"
               ,(char (*) [59])"failed: expected (0u) == (subReader.getInt32List().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_21,(uint *)local_58,
               (uint *)&_kjCondition_9);
  }
  if (subReader._reader.pointerCount < 9) {
    __kjCondition_9 = 0;
    auStack_b7._3_4_ = 0;
    uStack_b0 = 0;
    uStack_ac = 0;
  }
  else {
    __kjCondition_9 = subReader._reader.segment._0_4_;
    auStack_b7._3_4_ = subReader._reader.segment._4_4_;
    uStack_b0 = subReader._reader.capTable._0_4_;
    uStack_ac = subReader._reader.capTable._4_4_;
  }
  PointerReader::getList
            ((ListReader *)&_kjCondition,(PointerReader *)&_kjCondition_9,EIGHT_BYTES,(word *)0x0);
  auVar45._4_8_ = " == ";
  auVar45._0_4_ = _kjCondition._24_4_;
  auVar45._12_4_ = 0;
  __kjCondition_21 = (ArrayPtr<const_char>)(auVar45 << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar29._12_4_ = 0;
    auVar29._0_12_ = stack0xffffffffffffffac;
    _local_58 = (ArrayPtr<const_char>)(auVar29 << 0x20);
    if (subReader._reader.pointerCount < 9) {
      __kjCondition_9 = 0;
      auStack_b7._3_4_ = 0;
      uStack_b0 = 0;
      uStack_ac = 0;
    }
    else {
      __kjCondition_9 = subReader._reader.segment._0_4_;
      auStack_b7._3_4_ = subReader._reader.segment._4_4_;
      uStack_b0 = subReader._reader.capTable._0_4_;
      uStack_ac = subReader._reader.capTable._4_4_;
    }
    PointerReader::getList
              ((ListReader *)&_kjCondition,(PointerReader *)&_kjCondition_9,EIGHT_BYTES,(word *)0x0)
    ;
    auVar2 = (undefined1  [16])_kjCondition._16_16_;
    _kjCondition_9.value = _kjCondition.result;
    auStack_b7._0_3_ = _kjCondition._25_3_;
    _kjCondition._16_16_ = auVar2;
    kj::_::Debug::
    log<char_const(&)[59],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1ed,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getInt64List().size())\", _kjCondition, 0u, subReader.getInt64List().size()"
               ,(char (*) [59])"failed: expected (0u) == (subReader.getInt64List().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_21,(uint *)local_58,
               (uint *)&_kjCondition_9);
  }
  if (subReader._reader.pointerCount < 10) {
    __kjCondition_9 = 0;
    auStack_b7._3_4_ = 0;
    uStack_b0 = 0;
    uStack_ac = 0;
  }
  else {
    __kjCondition_9 = subReader._reader.segment._0_4_;
    auStack_b7._3_4_ = subReader._reader.segment._4_4_;
    uStack_b0 = subReader._reader.capTable._0_4_;
    uStack_ac = subReader._reader.capTable._4_4_;
  }
  PointerReader::getList
            ((ListReader *)&_kjCondition,(PointerReader *)&_kjCondition_9,BYTE,(word *)0x0);
  auVar46._4_8_ = " == ";
  auVar46._0_4_ = _kjCondition._24_4_;
  auVar46._12_4_ = 0;
  __kjCondition_21 = (ArrayPtr<const_char>)(auVar46 << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar30._12_4_ = 0;
    auVar30._0_12_ = stack0xffffffffffffffac;
    _local_58 = (ArrayPtr<const_char>)(auVar30 << 0x20);
    if (subReader._reader.pointerCount < 10) {
      __kjCondition_9 = 0;
      auStack_b7._3_4_ = 0;
      uStack_b0 = 0;
      uStack_ac = 0;
    }
    else {
      __kjCondition_9 = subReader._reader.segment._0_4_;
      auStack_b7._3_4_ = subReader._reader.segment._4_4_;
      uStack_b0 = subReader._reader.capTable._0_4_;
      uStack_ac = subReader._reader.capTable._4_4_;
    }
    PointerReader::getList
              ((ListReader *)&_kjCondition,(PointerReader *)&_kjCondition_9,BYTE,(word *)0x0);
    auVar2 = (undefined1  [16])_kjCondition._16_16_;
    _kjCondition_9.value = _kjCondition.result;
    auStack_b7._0_3_ = _kjCondition._25_3_;
    _kjCondition._16_16_ = auVar2;
    kj::_::Debug::
    log<char_const(&)[59],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1ee,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getUInt8List().size())\", _kjCondition, 0u, subReader.getUInt8List().size()"
               ,(char (*) [59])"failed: expected (0u) == (subReader.getUInt8List().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_21,(uint *)local_58,
               (uint *)&_kjCondition_9);
  }
  if (subReader._reader.pointerCount < 0xb) {
    __kjCondition_9 = 0;
    auStack_b7._3_4_ = 0;
    uStack_b0 = 0;
    uStack_ac = 0;
  }
  else {
    __kjCondition_9 = subReader._reader.segment._0_4_;
    auStack_b7._3_4_ = subReader._reader.segment._4_4_;
    uStack_b0 = subReader._reader.capTable._0_4_;
    uStack_ac = subReader._reader.capTable._4_4_;
  }
  PointerReader::getList
            ((ListReader *)&_kjCondition,(PointerReader *)&_kjCondition_9,TWO_BYTES,(word *)0x0);
  auVar47._4_8_ = " == ";
  auVar47._0_4_ = _kjCondition._24_4_;
  auVar47._12_4_ = 0;
  __kjCondition_21 = (ArrayPtr<const_char>)(auVar47 << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar31._12_4_ = 0;
    auVar31._0_12_ = stack0xffffffffffffffac;
    _local_58 = (ArrayPtr<const_char>)(auVar31 << 0x20);
    if (subReader._reader.pointerCount < 0xb) {
      __kjCondition_9 = 0;
      auStack_b7._3_4_ = 0;
      uStack_b0 = 0;
      uStack_ac = 0;
    }
    else {
      __kjCondition_9 = subReader._reader.segment._0_4_;
      auStack_b7._3_4_ = subReader._reader.segment._4_4_;
      uStack_b0 = subReader._reader.capTable._0_4_;
      uStack_ac = subReader._reader.capTable._4_4_;
    }
    PointerReader::getList
              ((ListReader *)&_kjCondition,(PointerReader *)&_kjCondition_9,TWO_BYTES,(word *)0x0);
    auVar2 = (undefined1  [16])_kjCondition._16_16_;
    _kjCondition_9.value = _kjCondition.result;
    auStack_b7._0_3_ = _kjCondition._25_3_;
    _kjCondition._16_16_ = auVar2;
    kj::_::Debug::
    log<char_const(&)[60],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1ef,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getUInt16List().size())\", _kjCondition, 0u, subReader.getUInt16List().size()"
               ,(char (*) [60])"failed: expected (0u) == (subReader.getUInt16List().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_21,(uint *)local_58,
               (uint *)&_kjCondition_9);
  }
  if (subReader._reader.pointerCount < 0xc) {
    __kjCondition_9 = 0;
    auStack_b7._3_4_ = 0;
    uStack_b0 = 0;
    uStack_ac = 0;
  }
  else {
    __kjCondition_9 = subReader._reader.segment._0_4_;
    auStack_b7._3_4_ = subReader._reader.segment._4_4_;
    uStack_b0 = subReader._reader.capTable._0_4_;
    uStack_ac = subReader._reader.capTable._4_4_;
  }
  PointerReader::getList
            ((ListReader *)&_kjCondition,(PointerReader *)&_kjCondition_9,FOUR_BYTES,(word *)0x0);
  auVar48._4_8_ = " == ";
  auVar48._0_4_ = _kjCondition._24_4_;
  auVar48._12_4_ = 0;
  __kjCondition_21 = (ArrayPtr<const_char>)(auVar48 << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar32._12_4_ = 0;
    auVar32._0_12_ = stack0xffffffffffffffac;
    _local_58 = (ArrayPtr<const_char>)(auVar32 << 0x20);
    if (subReader._reader.pointerCount < 0xc) {
      __kjCondition_9 = 0;
      auStack_b7._3_4_ = 0;
      uStack_b0 = 0;
      uStack_ac = 0;
    }
    else {
      __kjCondition_9 = subReader._reader.segment._0_4_;
      auStack_b7._3_4_ = subReader._reader.segment._4_4_;
      uStack_b0 = subReader._reader.capTable._0_4_;
      uStack_ac = subReader._reader.capTable._4_4_;
    }
    PointerReader::getList
              ((ListReader *)&_kjCondition,(PointerReader *)&_kjCondition_9,FOUR_BYTES,(word *)0x0);
    auVar2 = (undefined1  [16])_kjCondition._16_16_;
    _kjCondition_9.value = _kjCondition.result;
    auStack_b7._0_3_ = _kjCondition._25_3_;
    _kjCondition._16_16_ = auVar2;
    kj::_::Debug::
    log<char_const(&)[60],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1f0,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getUInt32List().size())\", _kjCondition, 0u, subReader.getUInt32List().size()"
               ,(char (*) [60])"failed: expected (0u) == (subReader.getUInt32List().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_21,(uint *)local_58,
               (uint *)&_kjCondition_9);
  }
  if (subReader._reader.pointerCount < 0xd) {
    __kjCondition_9 = 0;
    auStack_b7._3_4_ = 0;
    uStack_b0 = 0;
    uStack_ac = 0;
  }
  else {
    __kjCondition_9 = subReader._reader.segment._0_4_;
    auStack_b7._3_4_ = subReader._reader.segment._4_4_;
    uStack_b0 = subReader._reader.capTable._0_4_;
    uStack_ac = subReader._reader.capTable._4_4_;
  }
  PointerReader::getList
            ((ListReader *)&_kjCondition,(PointerReader *)&_kjCondition_9,EIGHT_BYTES,(word *)0x0);
  auVar49._4_8_ = " == ";
  auVar49._0_4_ = _kjCondition._24_4_;
  auVar49._12_4_ = 0;
  __kjCondition_21 = (ArrayPtr<const_char>)(auVar49 << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar33._12_4_ = 0;
    auVar33._0_12_ = stack0xffffffffffffffac;
    _local_58 = (ArrayPtr<const_char>)(auVar33 << 0x20);
    if (subReader._reader.pointerCount < 0xd) {
      __kjCondition_9 = 0;
      auStack_b7._3_4_ = 0;
      uStack_b0 = 0;
      uStack_ac = 0;
    }
    else {
      __kjCondition_9 = subReader._reader.segment._0_4_;
      auStack_b7._3_4_ = subReader._reader.segment._4_4_;
      uStack_b0 = subReader._reader.capTable._0_4_;
      uStack_ac = subReader._reader.capTable._4_4_;
    }
    PointerReader::getList
              ((ListReader *)&_kjCondition,(PointerReader *)&_kjCondition_9,EIGHT_BYTES,(word *)0x0)
    ;
    auVar2 = (undefined1  [16])_kjCondition._16_16_;
    _kjCondition_9.value = _kjCondition.result;
    auStack_b7._0_3_ = _kjCondition._25_3_;
    _kjCondition._16_16_ = auVar2;
    kj::_::Debug::
    log<char_const(&)[60],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1f1,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getUInt64List().size())\", _kjCondition, 0u, subReader.getUInt64List().size()"
               ,(char (*) [60])"failed: expected (0u) == (subReader.getUInt64List().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_21,(uint *)local_58,
               (uint *)&_kjCondition_9);
  }
  if (subReader._reader.pointerCount < 0xe) {
    __kjCondition_9 = 0;
    auStack_b7._3_4_ = 0;
    uStack_b0 = 0;
    uStack_ac = 0;
  }
  else {
    __kjCondition_9 = subReader._reader.segment._0_4_;
    auStack_b7._3_4_ = subReader._reader.segment._4_4_;
    uStack_b0 = subReader._reader.capTable._0_4_;
    uStack_ac = subReader._reader.capTable._4_4_;
  }
  PointerReader::getList
            ((ListReader *)&_kjCondition,(PointerReader *)&_kjCondition_9,FOUR_BYTES,(word *)0x0);
  auVar50._4_8_ = " == ";
  auVar50._0_4_ = _kjCondition._24_4_;
  auVar50._12_4_ = 0;
  __kjCondition_21 = (ArrayPtr<const_char>)(auVar50 << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar34._12_4_ = 0;
    auVar34._0_12_ = stack0xffffffffffffffac;
    _local_58 = (ArrayPtr<const_char>)(auVar34 << 0x20);
    if (subReader._reader.pointerCount < 0xe) {
      __kjCondition_9 = 0;
      auStack_b7._3_4_ = 0;
      uStack_b0 = 0;
      uStack_ac = 0;
    }
    else {
      __kjCondition_9 = subReader._reader.segment._0_4_;
      auStack_b7._3_4_ = subReader._reader.segment._4_4_;
      uStack_b0 = subReader._reader.capTable._0_4_;
      uStack_ac = subReader._reader.capTable._4_4_;
    }
    PointerReader::getList
              ((ListReader *)&_kjCondition,(PointerReader *)&_kjCondition_9,FOUR_BYTES,(word *)0x0);
    auVar2 = (undefined1  [16])_kjCondition._16_16_;
    _kjCondition_9.value = _kjCondition.result;
    auStack_b7._0_3_ = _kjCondition._25_3_;
    _kjCondition._16_16_ = auVar2;
    kj::_::Debug::
    log<char_const(&)[61],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1f2,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getFloat32List().size())\", _kjCondition, 0u, subReader.getFloat32List().size()"
               ,(char (*) [61])"failed: expected (0u) == (subReader.getFloat32List().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_21,(uint *)local_58,
               (uint *)&_kjCondition_9);
  }
  if (subReader._reader.pointerCount < 0xf) {
    __kjCondition_9 = 0;
    auStack_b7._3_4_ = 0;
    uStack_b0 = 0;
    uStack_ac = 0;
  }
  else {
    __kjCondition_9 = subReader._reader.segment._0_4_;
    auStack_b7._3_4_ = subReader._reader.segment._4_4_;
    uStack_b0 = subReader._reader.capTable._0_4_;
    uStack_ac = subReader._reader.capTable._4_4_;
  }
  PointerReader::getList
            ((ListReader *)&_kjCondition,(PointerReader *)&_kjCondition_9,EIGHT_BYTES,(word *)0x0);
  auVar51._4_8_ = " == ";
  auVar51._0_4_ = _kjCondition._24_4_;
  auVar51._12_4_ = 0;
  __kjCondition_21 = (ArrayPtr<const_char>)(auVar51 << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar35._12_4_ = 0;
    auVar35._0_12_ = stack0xffffffffffffffac;
    _local_58 = (ArrayPtr<const_char>)(auVar35 << 0x20);
    if (subReader._reader.pointerCount < 0xf) {
      __kjCondition_9 = 0;
      auStack_b7._3_4_ = 0;
      uStack_b0 = 0;
      uStack_ac = 0;
    }
    else {
      __kjCondition_9 = subReader._reader.segment._0_4_;
      auStack_b7._3_4_ = subReader._reader.segment._4_4_;
      uStack_b0 = subReader._reader.capTable._0_4_;
      uStack_ac = subReader._reader.capTable._4_4_;
    }
    PointerReader::getList
              ((ListReader *)&_kjCondition,(PointerReader *)&_kjCondition_9,EIGHT_BYTES,(word *)0x0)
    ;
    auVar2 = (undefined1  [16])_kjCondition._16_16_;
    _kjCondition_9.value = _kjCondition.result;
    auStack_b7._0_3_ = _kjCondition._25_3_;
    _kjCondition._16_16_ = auVar2;
    kj::_::Debug::
    log<char_const(&)[61],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,499,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getFloat64List().size())\", _kjCondition, 0u, subReader.getFloat64List().size()"
               ,(char (*) [61])"failed: expected (0u) == (subReader.getFloat64List().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_21,(uint *)local_58,
               (uint *)&_kjCondition_9);
  }
  if (subReader._reader.pointerCount < 0x10) {
    __kjCondition_9 = 0;
    auStack_b7._3_4_ = 0;
    uStack_b0 = 0;
    uStack_ac = 0;
  }
  else {
    __kjCondition_9 = subReader._reader.segment._0_4_;
    auStack_b7._3_4_ = subReader._reader.segment._4_4_;
    uStack_b0 = subReader._reader.capTable._0_4_;
    uStack_ac = subReader._reader.capTable._4_4_;
  }
  PointerReader::getList
            ((ListReader *)&_kjCondition,(PointerReader *)&_kjCondition_9,POINTER,(word *)0x0);
  auVar52._4_8_ = " == ";
  auVar52._0_4_ = _kjCondition._24_4_;
  auVar52._12_4_ = 0;
  __kjCondition_21 = (ArrayPtr<const_char>)(auVar52 << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar36._12_4_ = 0;
    auVar36._0_12_ = stack0xffffffffffffffac;
    _local_58 = (ArrayPtr<const_char>)(auVar36 << 0x20);
    if (subReader._reader.pointerCount < 0x10) {
      __kjCondition_9 = 0;
      auStack_b7._3_4_ = 0;
      uStack_b0 = 0;
      uStack_ac = 0;
    }
    else {
      __kjCondition_9 = subReader._reader.segment._0_4_;
      auStack_b7._3_4_ = subReader._reader.segment._4_4_;
      uStack_b0 = subReader._reader.capTable._0_4_;
      uStack_ac = subReader._reader.capTable._4_4_;
    }
    PointerReader::getList
              ((ListReader *)&_kjCondition,(PointerReader *)&_kjCondition_9,POINTER,(word *)0x0);
    auVar2 = (undefined1  [16])_kjCondition._16_16_;
    _kjCondition_9.value = _kjCondition.result;
    auStack_b7._0_3_ = _kjCondition._25_3_;
    _kjCondition._16_16_ = auVar2;
    kj::_::Debug::
    log<char_const(&)[58],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,500,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getTextList().size())\", _kjCondition, 0u, subReader.getTextList().size()"
               ,(char (*) [58])"failed: expected (0u) == (subReader.getTextList().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_21,(uint *)local_58,
               (uint *)&_kjCondition_9);
  }
  if (subReader._reader.pointerCount < 0x11) {
    __kjCondition_9 = 0;
    auStack_b7._3_4_ = 0;
    uStack_b0 = 0;
    uStack_ac = 0;
  }
  else {
    __kjCondition_9 = subReader._reader.segment._0_4_;
    auStack_b7._3_4_ = subReader._reader.segment._4_4_;
    uStack_b0 = subReader._reader.capTable._0_4_;
    uStack_ac = subReader._reader.capTable._4_4_;
  }
  PointerReader::getList
            ((ListReader *)&_kjCondition,(PointerReader *)&_kjCondition_9,POINTER,(word *)0x0);
  auVar53._4_8_ = " == ";
  auVar53._0_4_ = _kjCondition._24_4_;
  auVar53._12_4_ = 0;
  __kjCondition_21 = (ArrayPtr<const_char>)(auVar53 << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar37._12_4_ = 0;
    auVar37._0_12_ = stack0xffffffffffffffac;
    _local_58 = (ArrayPtr<const_char>)(auVar37 << 0x20);
    if (subReader._reader.pointerCount < 0x11) {
      __kjCondition_9 = 0;
      auStack_b7._3_4_ = 0;
      uStack_b0 = 0;
      uStack_ac = 0;
    }
    else {
      __kjCondition_9 = subReader._reader.segment._0_4_;
      auStack_b7._3_4_ = subReader._reader.segment._4_4_;
      uStack_b0 = subReader._reader.capTable._0_4_;
      uStack_ac = subReader._reader.capTable._4_4_;
    }
    PointerReader::getList
              ((ListReader *)&_kjCondition,(PointerReader *)&_kjCondition_9,POINTER,(word *)0x0);
    auVar2 = (undefined1  [16])_kjCondition._16_16_;
    _kjCondition_9.value = _kjCondition.result;
    auStack_b7._0_3_ = _kjCondition._25_3_;
    _kjCondition._16_16_ = auVar2;
    kj::_::Debug::
    log<char_const(&)[58],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1f5,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getDataList().size())\", _kjCondition, 0u, subReader.getDataList().size()"
               ,(char (*) [58])"failed: expected (0u) == (subReader.getDataList().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_21,(uint *)local_58,
               (uint *)&_kjCondition_9);
  }
  if (subReader._reader.pointerCount < 0x12) {
    __kjCondition_9 = 0;
    auStack_b7._3_4_ = 0;
    uStack_b0 = 0;
    uStack_ac = 0;
  }
  else {
    __kjCondition_9 = subReader._reader.segment._0_4_;
    auStack_b7._3_4_ = subReader._reader.segment._4_4_;
    uStack_b0 = subReader._reader.capTable._0_4_;
    uStack_ac = subReader._reader.capTable._4_4_;
  }
  PointerReader::getList
            ((ListReader *)&_kjCondition,(PointerReader *)&_kjCondition_9,INLINE_COMPOSITE,
             (word *)0x0);
  auVar39._4_8_ = " == ";
  auVar39._0_4_ = _kjCondition._24_4_;
  __kjCondition_21 = 0;
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar38._12_4_ = 0;
    auVar38._0_12_ = stack0xffffffffffffffac;
    _local_58 = (ArrayPtr<const_char>)(auVar38 << 0x20);
    if (subReader._reader.pointerCount < 0x12) {
      __kjCondition_9 = 0;
      auStack_b7._3_4_ = 0;
      uStack_b0 = 0;
      uStack_ac = 0;
    }
    else {
      __kjCondition_9 = subReader._reader.segment._0_4_;
      auStack_b7._3_4_ = subReader._reader.segment._4_4_;
      uStack_b0 = subReader._reader.capTable._0_4_;
      uStack_ac = subReader._reader.capTable._4_4_;
    }
    PointerReader::getList
              ((ListReader *)&_kjCondition,(PointerReader *)&_kjCondition_9,INLINE_COMPOSITE,
               (word *)0x0);
    auVar2 = (undefined1  [16])_kjCondition._16_16_;
    _kjCondition_9.value = _kjCondition.result;
    auStack_b7._0_3_ = _kjCondition._25_3_;
    _kjCondition._16_16_ = auVar2;
    kj::_::Debug::
    log<char_const(&)[60],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1f6,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getStructList().size())\", _kjCondition, 0u, subReader.getStructList().size()"
               ,(char (*) [60])"failed: expected (0u) == (subReader.getStructList().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_21,(uint *)local_58,
               (uint *)&_kjCondition_9);
  }
  subReader._reader.data = reader._reader.pointers + 3;
  if (reader._reader.pointerCount < 4) {
    subReader._reader.data = (WirePointer *)0x0;
  }
  subReader._reader.segment._0_4_ = reader._reader.segment._0_4_;
  subReader._reader.segment._4_4_ = reader._reader.segment._4_4_;
  subReader._reader.capTable._0_4_ = reader._reader.capTable._0_4_;
  subReader._reader.capTable._4_4_ = reader._reader.capTable._4_4_;
  subReader._reader.pointers._0_4_ = reader._reader.nestingLimit;
  if (reader._reader.pointerCount < 4) {
    subReader._reader.segment._0_4_ = 0;
    subReader._reader.segment._4_4_ = 0;
    subReader._reader.capTable._0_4_ = 0;
    subReader._reader.capTable._4_4_ = 0;
    subReader._reader.pointers._0_4_ = 0x7fffffff;
  }
  PointerReader::getList((ListReader *)&_kjCondition,(PointerReader *)&subReader,VOID,(word *)0x0);
  auVar54._4_8_ = " == ";
  auVar54._0_4_ = _kjCondition._24_4_;
  auVar54._12_4_ = 0;
  __kjCondition_9 = (ArrayPtr<const_unsigned_char>)(auVar54 << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    __kjCondition_21 = 0;
    subReader._reader.data = reader._reader.pointers + 3;
    if (reader._reader.pointerCount < 4) {
      subReader._reader.data = (WirePointer *)0x0;
    }
    subReader._reader.segment._0_4_ = reader._reader.segment._0_4_;
    subReader._reader.segment._4_4_ = reader._reader.segment._4_4_;
    subReader._reader.capTable._0_4_ = reader._reader.capTable._0_4_;
    subReader._reader.capTable._4_4_ = reader._reader.capTable._4_4_;
    subReader._reader.pointers._0_4_ = reader._reader.nestingLimit;
    if (reader._reader.pointerCount < 4) {
      subReader._reader.segment._0_4_ = 0;
      subReader._reader.segment._4_4_ = 0;
      subReader._reader.capTable._0_4_ = 0;
      subReader._reader.capTable._4_4_ = 0;
      subReader._reader.pointers._0_4_ = 0x7fffffff;
    }
    PointerReader::getList((ListReader *)&_kjCondition,(PointerReader *)&subReader,VOID,(word *)0x0)
    ;
    auVar2 = (undefined1  [16])_kjCondition._16_16_;
    subReader._reader.segment._0_1_ = _kjCondition.result;
    subReader._reader.segment._1_3_ = _kjCondition._25_3_;
    _kjCondition._16_16_ = auVar2;
    kj::_::Debug::
    log<char_const(&)[55],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1f9,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getVoidList().size())\", _kjCondition, 0u, reader.getVoidList().size()"
               ,(char (*) [55])"failed: expected (0u) == (reader.getVoidList().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_9,
               (uint *)&_kjCondition_21,(uint *)&subReader);
  }
  subReader._reader.data = reader._reader.pointers + 4;
  if (reader._reader.pointerCount < 5) {
    subReader._reader.data = (WirePointer *)0x0;
  }
  subReader._reader.segment._0_4_ = reader._reader.segment._0_4_;
  subReader._reader.segment._4_4_ = reader._reader.segment._4_4_;
  subReader._reader.capTable._0_4_ = reader._reader.capTable._0_4_;
  subReader._reader.capTable._4_4_ = reader._reader.capTable._4_4_;
  subReader._reader.pointers._0_4_ = reader._reader.nestingLimit;
  if (reader._reader.pointerCount < 5) {
    subReader._reader.segment._0_4_ = 0;
    subReader._reader.segment._4_4_ = 0;
    subReader._reader.capTable._0_4_ = 0;
    subReader._reader.capTable._4_4_ = 0;
    subReader._reader.pointers._0_4_ = 0x7fffffff;
  }
  PointerReader::getList((ListReader *)&_kjCondition,(PointerReader *)&subReader,BIT,(word *)0x0);
  auVar55._4_8_ = " == ";
  auVar55._0_4_ = _kjCondition._24_4_;
  auVar55._12_4_ = 0;
  __kjCondition_9 = (ArrayPtr<const_unsigned_char>)(auVar55 << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    __kjCondition_21 = 0;
    subReader._reader.data = reader._reader.pointers + 4;
    if (reader._reader.pointerCount < 5) {
      subReader._reader.data = (WirePointer *)0x0;
    }
    subReader._reader.segment._0_4_ = reader._reader.segment._0_4_;
    subReader._reader.segment._4_4_ = reader._reader.segment._4_4_;
    subReader._reader.capTable._0_4_ = reader._reader.capTable._0_4_;
    subReader._reader.capTable._4_4_ = reader._reader.capTable._4_4_;
    subReader._reader.pointers._0_4_ = reader._reader.nestingLimit;
    if (reader._reader.pointerCount < 5) {
      subReader._reader.segment._0_4_ = 0;
      subReader._reader.segment._4_4_ = 0;
      subReader._reader.capTable._0_4_ = 0;
      subReader._reader.capTable._4_4_ = 0;
      subReader._reader.pointers._0_4_ = 0x7fffffff;
    }
    PointerReader::getList((ListReader *)&_kjCondition,(PointerReader *)&subReader,BIT,(word *)0x0);
    auVar2 = (undefined1  [16])_kjCondition._16_16_;
    subReader._reader.segment._0_1_ = _kjCondition.result;
    subReader._reader.segment._1_3_ = _kjCondition._25_3_;
    _kjCondition._16_16_ = auVar2;
    kj::_::Debug::
    log<char_const(&)[55],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1fa,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getBoolList().size())\", _kjCondition, 0u, reader.getBoolList().size()"
               ,(char (*) [55])"failed: expected (0u) == (reader.getBoolList().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_9,
               (uint *)&_kjCondition_21,(uint *)&subReader);
  }
  subReader._reader.data = reader._reader.pointers + 5;
  if (reader._reader.pointerCount < 6) {
    subReader._reader.data = (WirePointer *)0x0;
  }
  subReader._reader.segment._0_4_ = reader._reader.segment._0_4_;
  subReader._reader.segment._4_4_ = reader._reader.segment._4_4_;
  subReader._reader.capTable._0_4_ = reader._reader.capTable._0_4_;
  subReader._reader.capTable._4_4_ = reader._reader.capTable._4_4_;
  subReader._reader.pointers._0_4_ = reader._reader.nestingLimit;
  if (reader._reader.pointerCount < 6) {
    subReader._reader.segment._0_4_ = 0;
    subReader._reader.segment._4_4_ = 0;
    subReader._reader.capTable._0_4_ = 0;
    subReader._reader.capTable._4_4_ = 0;
    subReader._reader.pointers._0_4_ = 0x7fffffff;
  }
  PointerReader::getList((ListReader *)&_kjCondition,(PointerReader *)&subReader,BYTE,(word *)0x0);
  auVar56._4_8_ = " == ";
  auVar56._0_4_ = _kjCondition._24_4_;
  auVar56._12_4_ = 0;
  __kjCondition_9 = (ArrayPtr<const_unsigned_char>)(auVar56 << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    __kjCondition_21 = 0;
    subReader._reader.data = reader._reader.pointers + 5;
    if (reader._reader.pointerCount < 6) {
      subReader._reader.data = (WirePointer *)0x0;
    }
    subReader._reader.segment._0_4_ = reader._reader.segment._0_4_;
    subReader._reader.segment._4_4_ = reader._reader.segment._4_4_;
    subReader._reader.capTable._0_4_ = reader._reader.capTable._0_4_;
    subReader._reader.capTable._4_4_ = reader._reader.capTable._4_4_;
    subReader._reader.pointers._0_4_ = reader._reader.nestingLimit;
    if (reader._reader.pointerCount < 6) {
      subReader._reader.segment._0_4_ = 0;
      subReader._reader.segment._4_4_ = 0;
      subReader._reader.capTable._0_4_ = 0;
      subReader._reader.capTable._4_4_ = 0;
      subReader._reader.pointers._0_4_ = 0x7fffffff;
    }
    PointerReader::getList((ListReader *)&_kjCondition,(PointerReader *)&subReader,BYTE,(word *)0x0)
    ;
    auVar2 = (undefined1  [16])_kjCondition._16_16_;
    subReader._reader.segment._0_1_ = _kjCondition.result;
    subReader._reader.segment._1_3_ = _kjCondition._25_3_;
    _kjCondition._16_16_ = auVar2;
    kj::_::Debug::
    log<char_const(&)[55],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1fb,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getInt8List().size())\", _kjCondition, 0u, reader.getInt8List().size()"
               ,(char (*) [55])"failed: expected (0u) == (reader.getInt8List().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_9,
               (uint *)&_kjCondition_21,(uint *)&subReader);
  }
  subReader._reader.data = reader._reader.pointers + 6;
  if (reader._reader.pointerCount < 7) {
    subReader._reader.data = (WirePointer *)0x0;
  }
  subReader._reader.segment._0_4_ = reader._reader.segment._0_4_;
  subReader._reader.segment._4_4_ = reader._reader.segment._4_4_;
  subReader._reader.capTable._0_4_ = reader._reader.capTable._0_4_;
  subReader._reader.capTable._4_4_ = reader._reader.capTable._4_4_;
  subReader._reader.pointers._0_4_ = reader._reader.nestingLimit;
  if (reader._reader.pointerCount < 7) {
    subReader._reader.segment._0_4_ = 0;
    subReader._reader.segment._4_4_ = 0;
    subReader._reader.capTable._0_4_ = 0;
    subReader._reader.capTable._4_4_ = 0;
    subReader._reader.pointers._0_4_ = 0x7fffffff;
  }
  PointerReader::getList
            ((ListReader *)&_kjCondition,(PointerReader *)&subReader,TWO_BYTES,(word *)0x0);
  auVar57._4_8_ = " == ";
  auVar57._0_4_ = _kjCondition._24_4_;
  auVar57._12_4_ = 0;
  __kjCondition_9 = (ArrayPtr<const_unsigned_char>)(auVar57 << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    __kjCondition_21 = 0;
    subReader._reader.data = reader._reader.pointers + 6;
    if (reader._reader.pointerCount < 7) {
      subReader._reader.data = (WirePointer *)0x0;
    }
    subReader._reader.segment._0_4_ = reader._reader.segment._0_4_;
    subReader._reader.segment._4_4_ = reader._reader.segment._4_4_;
    subReader._reader.capTable._0_4_ = reader._reader.capTable._0_4_;
    subReader._reader.capTable._4_4_ = reader._reader.capTable._4_4_;
    subReader._reader.pointers._0_4_ = reader._reader.nestingLimit;
    if (reader._reader.pointerCount < 7) {
      subReader._reader.segment._0_4_ = 0;
      subReader._reader.segment._4_4_ = 0;
      subReader._reader.capTable._0_4_ = 0;
      subReader._reader.capTable._4_4_ = 0;
      subReader._reader.pointers._0_4_ = 0x7fffffff;
    }
    PointerReader::getList
              ((ListReader *)&_kjCondition,(PointerReader *)&subReader,TWO_BYTES,(word *)0x0);
    auVar2 = (undefined1  [16])_kjCondition._16_16_;
    subReader._reader.segment._0_1_ = _kjCondition.result;
    subReader._reader.segment._1_3_ = _kjCondition._25_3_;
    _kjCondition._16_16_ = auVar2;
    kj::_::Debug::
    log<char_const(&)[56],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1fc,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getInt16List().size())\", _kjCondition, 0u, reader.getInt16List().size()"
               ,(char (*) [56])"failed: expected (0u) == (reader.getInt16List().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_9,
               (uint *)&_kjCondition_21,(uint *)&subReader);
  }
  subReader._reader.data = reader._reader.pointers + 7;
  if (reader._reader.pointerCount < 8) {
    subReader._reader.data = (WirePointer *)0x0;
  }
  subReader._reader.segment._0_4_ = reader._reader.segment._0_4_;
  subReader._reader.segment._4_4_ = reader._reader.segment._4_4_;
  subReader._reader.capTable._0_4_ = reader._reader.capTable._0_4_;
  subReader._reader.capTable._4_4_ = reader._reader.capTable._4_4_;
  subReader._reader.pointers._0_4_ = reader._reader.nestingLimit;
  if (reader._reader.pointerCount < 8) {
    subReader._reader.segment._0_4_ = 0;
    subReader._reader.segment._4_4_ = 0;
    subReader._reader.capTable._0_4_ = 0;
    subReader._reader.capTable._4_4_ = 0;
    subReader._reader.pointers._0_4_ = 0x7fffffff;
  }
  PointerReader::getList
            ((ListReader *)&_kjCondition,(PointerReader *)&subReader,FOUR_BYTES,(word *)0x0);
  auVar58._4_8_ = " == ";
  auVar58._0_4_ = _kjCondition._24_4_;
  auVar58._12_4_ = 0;
  __kjCondition_9 = (ArrayPtr<const_unsigned_char>)(auVar58 << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    __kjCondition_21 = 0;
    subReader._reader.data = reader._reader.pointers + 7;
    if (reader._reader.pointerCount < 8) {
      subReader._reader.data = (WirePointer *)0x0;
    }
    subReader._reader.segment._0_4_ = reader._reader.segment._0_4_;
    subReader._reader.segment._4_4_ = reader._reader.segment._4_4_;
    subReader._reader.capTable._0_4_ = reader._reader.capTable._0_4_;
    subReader._reader.capTable._4_4_ = reader._reader.capTable._4_4_;
    subReader._reader.pointers._0_4_ = reader._reader.nestingLimit;
    if (reader._reader.pointerCount < 8) {
      subReader._reader.segment._0_4_ = 0;
      subReader._reader.segment._4_4_ = 0;
      subReader._reader.capTable._0_4_ = 0;
      subReader._reader.capTable._4_4_ = 0;
      subReader._reader.pointers._0_4_ = 0x7fffffff;
    }
    PointerReader::getList
              ((ListReader *)&_kjCondition,(PointerReader *)&subReader,FOUR_BYTES,(word *)0x0);
    auVar2 = (undefined1  [16])_kjCondition._16_16_;
    subReader._reader.segment._0_1_ = _kjCondition.result;
    subReader._reader.segment._1_3_ = _kjCondition._25_3_;
    _kjCondition._16_16_ = auVar2;
    kj::_::Debug::
    log<char_const(&)[56],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1fd,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getInt32List().size())\", _kjCondition, 0u, reader.getInt32List().size()"
               ,(char (*) [56])"failed: expected (0u) == (reader.getInt32List().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_9,
               (uint *)&_kjCondition_21,(uint *)&subReader);
  }
  subReader._reader.data = reader._reader.pointers + 8;
  if (reader._reader.pointerCount < 9) {
    subReader._reader.data = (WirePointer *)0x0;
  }
  subReader._reader.segment._0_4_ = reader._reader.segment._0_4_;
  subReader._reader.segment._4_4_ = reader._reader.segment._4_4_;
  subReader._reader.capTable._0_4_ = reader._reader.capTable._0_4_;
  subReader._reader.capTable._4_4_ = reader._reader.capTable._4_4_;
  subReader._reader.pointers._0_4_ = reader._reader.nestingLimit;
  if (reader._reader.pointerCount < 9) {
    subReader._reader.segment._0_4_ = 0;
    subReader._reader.segment._4_4_ = 0;
    subReader._reader.capTable._0_4_ = 0;
    subReader._reader.capTable._4_4_ = 0;
    subReader._reader.pointers._0_4_ = 0x7fffffff;
  }
  PointerReader::getList
            ((ListReader *)&_kjCondition,(PointerReader *)&subReader,EIGHT_BYTES,(word *)0x0);
  auVar59._4_8_ = " == ";
  auVar59._0_4_ = _kjCondition._24_4_;
  auVar59._12_4_ = 0;
  __kjCondition_9 = (ArrayPtr<const_unsigned_char>)(auVar59 << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    __kjCondition_21 = 0;
    subReader._reader.data = reader._reader.pointers + 8;
    if (reader._reader.pointerCount < 9) {
      subReader._reader.data = (WirePointer *)0x0;
    }
    subReader._reader.segment._0_4_ = reader._reader.segment._0_4_;
    subReader._reader.segment._4_4_ = reader._reader.segment._4_4_;
    subReader._reader.capTable._0_4_ = reader._reader.capTable._0_4_;
    subReader._reader.capTable._4_4_ = reader._reader.capTable._4_4_;
    subReader._reader.pointers._0_4_ = reader._reader.nestingLimit;
    if (reader._reader.pointerCount < 9) {
      subReader._reader.segment._0_4_ = 0;
      subReader._reader.segment._4_4_ = 0;
      subReader._reader.capTable._0_4_ = 0;
      subReader._reader.capTable._4_4_ = 0;
      subReader._reader.pointers._0_4_ = 0x7fffffff;
    }
    PointerReader::getList
              ((ListReader *)&_kjCondition,(PointerReader *)&subReader,EIGHT_BYTES,(word *)0x0);
    auVar2 = (undefined1  [16])_kjCondition._16_16_;
    subReader._reader.segment._0_1_ = _kjCondition.result;
    subReader._reader.segment._1_3_ = _kjCondition._25_3_;
    _kjCondition._16_16_ = auVar2;
    kj::_::Debug::
    log<char_const(&)[56],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1fe,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getInt64List().size())\", _kjCondition, 0u, reader.getInt64List().size()"
               ,(char (*) [56])"failed: expected (0u) == (reader.getInt64List().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_9,
               (uint *)&_kjCondition_21,(uint *)&subReader);
  }
  subReader._reader.data = reader._reader.pointers + 9;
  if (reader._reader.pointerCount < 10) {
    subReader._reader.data = (WirePointer *)0x0;
  }
  subReader._reader.segment._0_4_ = reader._reader.segment._0_4_;
  subReader._reader.segment._4_4_ = reader._reader.segment._4_4_;
  subReader._reader.capTable._0_4_ = reader._reader.capTable._0_4_;
  subReader._reader.capTable._4_4_ = reader._reader.capTable._4_4_;
  subReader._reader.pointers._0_4_ = reader._reader.nestingLimit;
  if (reader._reader.pointerCount < 10) {
    subReader._reader.segment._0_4_ = 0;
    subReader._reader.segment._4_4_ = 0;
    subReader._reader.capTable._0_4_ = 0;
    subReader._reader.capTable._4_4_ = 0;
    subReader._reader.pointers._0_4_ = 0x7fffffff;
  }
  PointerReader::getList((ListReader *)&_kjCondition,(PointerReader *)&subReader,BYTE,(word *)0x0);
  auVar60._4_8_ = " == ";
  auVar60._0_4_ = _kjCondition._24_4_;
  auVar60._12_4_ = 0;
  __kjCondition_9 = (ArrayPtr<const_unsigned_char>)(auVar60 << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    __kjCondition_21 = 0;
    subReader._reader.data = reader._reader.pointers + 9;
    if (reader._reader.pointerCount < 10) {
      subReader._reader.data = (WirePointer *)0x0;
    }
    subReader._reader.segment._0_4_ = reader._reader.segment._0_4_;
    subReader._reader.segment._4_4_ = reader._reader.segment._4_4_;
    subReader._reader.capTable._0_4_ = reader._reader.capTable._0_4_;
    subReader._reader.capTable._4_4_ = reader._reader.capTable._4_4_;
    subReader._reader.pointers._0_4_ = reader._reader.nestingLimit;
    if (reader._reader.pointerCount < 10) {
      subReader._reader.segment._0_4_ = 0;
      subReader._reader.segment._4_4_ = 0;
      subReader._reader.capTable._0_4_ = 0;
      subReader._reader.capTable._4_4_ = 0;
      subReader._reader.pointers._0_4_ = 0x7fffffff;
    }
    PointerReader::getList((ListReader *)&_kjCondition,(PointerReader *)&subReader,BYTE,(word *)0x0)
    ;
    auVar2 = (undefined1  [16])_kjCondition._16_16_;
    subReader._reader.segment._0_1_ = _kjCondition.result;
    subReader._reader.segment._1_3_ = _kjCondition._25_3_;
    _kjCondition._16_16_ = auVar2;
    kj::_::Debug::
    log<char_const(&)[56],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1ff,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getUInt8List().size())\", _kjCondition, 0u, reader.getUInt8List().size()"
               ,(char (*) [56])"failed: expected (0u) == (reader.getUInt8List().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_9,
               (uint *)&_kjCondition_21,(uint *)&subReader);
  }
  subReader._reader.data = reader._reader.pointers + 10;
  if (reader._reader.pointerCount < 0xb) {
    subReader._reader.data = (WirePointer *)0x0;
  }
  subReader._reader.segment._0_4_ = reader._reader.segment._0_4_;
  subReader._reader.segment._4_4_ = reader._reader.segment._4_4_;
  subReader._reader.capTable._0_4_ = reader._reader.capTable._0_4_;
  subReader._reader.capTable._4_4_ = reader._reader.capTable._4_4_;
  subReader._reader.pointers._0_4_ = reader._reader.nestingLimit;
  if (reader._reader.pointerCount < 0xb) {
    subReader._reader.segment._0_4_ = 0;
    subReader._reader.segment._4_4_ = 0;
    subReader._reader.capTable._0_4_ = 0;
    subReader._reader.capTable._4_4_ = 0;
    subReader._reader.pointers._0_4_ = 0x7fffffff;
  }
  PointerReader::getList
            ((ListReader *)&_kjCondition,(PointerReader *)&subReader,TWO_BYTES,(word *)0x0);
  auVar61._4_8_ = " == ";
  auVar61._0_4_ = _kjCondition._24_4_;
  auVar61._12_4_ = 0;
  __kjCondition_9 = (ArrayPtr<const_unsigned_char>)(auVar61 << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    __kjCondition_21 = 0;
    subReader._reader.data = reader._reader.pointers + 10;
    if (reader._reader.pointerCount < 0xb) {
      subReader._reader.data = (WirePointer *)0x0;
    }
    subReader._reader.segment._0_4_ = reader._reader.segment._0_4_;
    subReader._reader.segment._4_4_ = reader._reader.segment._4_4_;
    subReader._reader.capTable._0_4_ = reader._reader.capTable._0_4_;
    subReader._reader.capTable._4_4_ = reader._reader.capTable._4_4_;
    subReader._reader.pointers._0_4_ = reader._reader.nestingLimit;
    if (reader._reader.pointerCount < 0xb) {
      subReader._reader.segment._0_4_ = 0;
      subReader._reader.segment._4_4_ = 0;
      subReader._reader.capTable._0_4_ = 0;
      subReader._reader.capTable._4_4_ = 0;
      subReader._reader.pointers._0_4_ = 0x7fffffff;
    }
    PointerReader::getList
              ((ListReader *)&_kjCondition,(PointerReader *)&subReader,TWO_BYTES,(word *)0x0);
    auVar2 = (undefined1  [16])_kjCondition._16_16_;
    subReader._reader.segment._0_1_ = _kjCondition.result;
    subReader._reader.segment._1_3_ = _kjCondition._25_3_;
    _kjCondition._16_16_ = auVar2;
    kj::_::Debug::
    log<char_const(&)[57],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x200,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getUInt16List().size())\", _kjCondition, 0u, reader.getUInt16List().size()"
               ,(char (*) [57])"failed: expected (0u) == (reader.getUInt16List().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_9,
               (uint *)&_kjCondition_21,(uint *)&subReader);
  }
  subReader._reader.data = reader._reader.pointers + 0xb;
  if (reader._reader.pointerCount < 0xc) {
    subReader._reader.data = (WirePointer *)0x0;
  }
  subReader._reader.segment._0_4_ = reader._reader.segment._0_4_;
  subReader._reader.segment._4_4_ = reader._reader.segment._4_4_;
  subReader._reader.capTable._0_4_ = reader._reader.capTable._0_4_;
  subReader._reader.capTable._4_4_ = reader._reader.capTable._4_4_;
  subReader._reader.pointers._0_4_ = reader._reader.nestingLimit;
  if (reader._reader.pointerCount < 0xc) {
    subReader._reader.segment._0_4_ = 0;
    subReader._reader.segment._4_4_ = 0;
    subReader._reader.capTable._0_4_ = 0;
    subReader._reader.capTable._4_4_ = 0;
    subReader._reader.pointers._0_4_ = 0x7fffffff;
  }
  PointerReader::getList
            ((ListReader *)&_kjCondition,(PointerReader *)&subReader,FOUR_BYTES,(word *)0x0);
  auVar62._4_8_ = " == ";
  auVar62._0_4_ = _kjCondition._24_4_;
  auVar62._12_4_ = 0;
  __kjCondition_9 = (ArrayPtr<const_unsigned_char>)(auVar62 << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    __kjCondition_21 = 0;
    subReader._reader.data = reader._reader.pointers + 0xb;
    if (reader._reader.pointerCount < 0xc) {
      subReader._reader.data = (WirePointer *)0x0;
    }
    subReader._reader.segment._0_4_ = reader._reader.segment._0_4_;
    subReader._reader.segment._4_4_ = reader._reader.segment._4_4_;
    subReader._reader.capTable._0_4_ = reader._reader.capTable._0_4_;
    subReader._reader.capTable._4_4_ = reader._reader.capTable._4_4_;
    subReader._reader.pointers._0_4_ = reader._reader.nestingLimit;
    if (reader._reader.pointerCount < 0xc) {
      subReader._reader.segment._0_4_ = 0;
      subReader._reader.segment._4_4_ = 0;
      subReader._reader.capTable._0_4_ = 0;
      subReader._reader.capTable._4_4_ = 0;
      subReader._reader.pointers._0_4_ = 0x7fffffff;
    }
    PointerReader::getList
              ((ListReader *)&_kjCondition,(PointerReader *)&subReader,FOUR_BYTES,(word *)0x0);
    auVar2 = (undefined1  [16])_kjCondition._16_16_;
    subReader._reader.segment._0_1_ = _kjCondition.result;
    subReader._reader.segment._1_3_ = _kjCondition._25_3_;
    _kjCondition._16_16_ = auVar2;
    kj::_::Debug::
    log<char_const(&)[57],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x201,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getUInt32List().size())\", _kjCondition, 0u, reader.getUInt32List().size()"
               ,(char (*) [57])"failed: expected (0u) == (reader.getUInt32List().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_9,
               (uint *)&_kjCondition_21,(uint *)&subReader);
  }
  subReader._reader.data = reader._reader.pointers + 0xc;
  if (reader._reader.pointerCount < 0xd) {
    subReader._reader.data = (WirePointer *)0x0;
  }
  subReader._reader.segment._0_4_ = reader._reader.segment._0_4_;
  subReader._reader.segment._4_4_ = reader._reader.segment._4_4_;
  subReader._reader.capTable._0_4_ = reader._reader.capTable._0_4_;
  subReader._reader.capTable._4_4_ = reader._reader.capTable._4_4_;
  subReader._reader.pointers._0_4_ = reader._reader.nestingLimit;
  if (reader._reader.pointerCount < 0xd) {
    subReader._reader.segment._0_4_ = 0;
    subReader._reader.segment._4_4_ = 0;
    subReader._reader.capTable._0_4_ = 0;
    subReader._reader.capTable._4_4_ = 0;
    subReader._reader.pointers._0_4_ = 0x7fffffff;
  }
  PointerReader::getList
            ((ListReader *)&_kjCondition,(PointerReader *)&subReader,EIGHT_BYTES,(word *)0x0);
  auVar63._4_8_ = " == ";
  auVar63._0_4_ = _kjCondition._24_4_;
  auVar63._12_4_ = 0;
  __kjCondition_9 = (ArrayPtr<const_unsigned_char>)(auVar63 << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    __kjCondition_21 = 0;
    subReader._reader.data = reader._reader.pointers + 0xc;
    if (reader._reader.pointerCount < 0xd) {
      subReader._reader.data = (WirePointer *)0x0;
    }
    subReader._reader.segment._0_4_ = reader._reader.segment._0_4_;
    subReader._reader.segment._4_4_ = reader._reader.segment._4_4_;
    subReader._reader.capTable._0_4_ = reader._reader.capTable._0_4_;
    subReader._reader.capTable._4_4_ = reader._reader.capTable._4_4_;
    subReader._reader.pointers._0_4_ = reader._reader.nestingLimit;
    if (reader._reader.pointerCount < 0xd) {
      subReader._reader.segment._0_4_ = 0;
      subReader._reader.segment._4_4_ = 0;
      subReader._reader.capTable._0_4_ = 0;
      subReader._reader.capTable._4_4_ = 0;
      subReader._reader.pointers._0_4_ = 0x7fffffff;
    }
    PointerReader::getList
              ((ListReader *)&_kjCondition,(PointerReader *)&subReader,EIGHT_BYTES,(word *)0x0);
    auVar2 = (undefined1  [16])_kjCondition._16_16_;
    subReader._reader.segment._0_1_ = _kjCondition.result;
    subReader._reader.segment._1_3_ = _kjCondition._25_3_;
    _kjCondition._16_16_ = auVar2;
    kj::_::Debug::
    log<char_const(&)[57],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x202,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getUInt64List().size())\", _kjCondition, 0u, reader.getUInt64List().size()"
               ,(char (*) [57])"failed: expected (0u) == (reader.getUInt64List().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_9,
               (uint *)&_kjCondition_21,(uint *)&subReader);
  }
  subReader._reader.data = reader._reader.pointers + 0xd;
  if (reader._reader.pointerCount < 0xe) {
    subReader._reader.data = (WirePointer *)0x0;
  }
  subReader._reader.segment._0_4_ = reader._reader.segment._0_4_;
  subReader._reader.segment._4_4_ = reader._reader.segment._4_4_;
  subReader._reader.capTable._0_4_ = reader._reader.capTable._0_4_;
  subReader._reader.capTable._4_4_ = reader._reader.capTable._4_4_;
  subReader._reader.pointers._0_4_ = reader._reader.nestingLimit;
  if (reader._reader.pointerCount < 0xe) {
    subReader._reader.segment._0_4_ = 0;
    subReader._reader.segment._4_4_ = 0;
    subReader._reader.capTable._0_4_ = 0;
    subReader._reader.capTable._4_4_ = 0;
    subReader._reader.pointers._0_4_ = 0x7fffffff;
  }
  PointerReader::getList
            ((ListReader *)&_kjCondition,(PointerReader *)&subReader,FOUR_BYTES,(word *)0x0);
  auVar64._4_8_ = " == ";
  auVar64._0_4_ = _kjCondition._24_4_;
  auVar64._12_4_ = 0;
  __kjCondition_9 = (ArrayPtr<const_unsigned_char>)(auVar64 << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    __kjCondition_21 = 0;
    subReader._reader.data = reader._reader.pointers + 0xd;
    if (reader._reader.pointerCount < 0xe) {
      subReader._reader.data = (WirePointer *)0x0;
    }
    subReader._reader.segment._0_4_ = reader._reader.segment._0_4_;
    subReader._reader.segment._4_4_ = reader._reader.segment._4_4_;
    subReader._reader.capTable._0_4_ = reader._reader.capTable._0_4_;
    subReader._reader.capTable._4_4_ = reader._reader.capTable._4_4_;
    subReader._reader.pointers._0_4_ = reader._reader.nestingLimit;
    if (reader._reader.pointerCount < 0xe) {
      subReader._reader.segment._0_4_ = 0;
      subReader._reader.segment._4_4_ = 0;
      subReader._reader.capTable._0_4_ = 0;
      subReader._reader.capTable._4_4_ = 0;
      subReader._reader.pointers._0_4_ = 0x7fffffff;
    }
    PointerReader::getList
              ((ListReader *)&_kjCondition,(PointerReader *)&subReader,FOUR_BYTES,(word *)0x0);
    auVar2 = (undefined1  [16])_kjCondition._16_16_;
    subReader._reader.segment._0_1_ = _kjCondition.result;
    subReader._reader.segment._1_3_ = _kjCondition._25_3_;
    _kjCondition._16_16_ = auVar2;
    kj::_::Debug::
    log<char_const(&)[58],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x203,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getFloat32List().size())\", _kjCondition, 0u, reader.getFloat32List().size()"
               ,(char (*) [58])"failed: expected (0u) == (reader.getFloat32List().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_9,
               (uint *)&_kjCondition_21,(uint *)&subReader);
  }
  subReader._reader.data = reader._reader.pointers + 0xe;
  if (reader._reader.pointerCount < 0xf) {
    subReader._reader.data = (WirePointer *)0x0;
  }
  subReader._reader.segment._0_4_ = reader._reader.segment._0_4_;
  subReader._reader.segment._4_4_ = reader._reader.segment._4_4_;
  subReader._reader.capTable._0_4_ = reader._reader.capTable._0_4_;
  subReader._reader.capTable._4_4_ = reader._reader.capTable._4_4_;
  subReader._reader.pointers._0_4_ = reader._reader.nestingLimit;
  if (reader._reader.pointerCount < 0xf) {
    subReader._reader.segment._0_4_ = 0;
    subReader._reader.segment._4_4_ = 0;
    subReader._reader.capTable._0_4_ = 0;
    subReader._reader.capTable._4_4_ = 0;
    subReader._reader.pointers._0_4_ = 0x7fffffff;
  }
  PointerReader::getList
            ((ListReader *)&_kjCondition,(PointerReader *)&subReader,EIGHT_BYTES,(word *)0x0);
  auVar65._4_8_ = " == ";
  auVar65._0_4_ = _kjCondition._24_4_;
  auVar65._12_4_ = 0;
  __kjCondition_9 = (ArrayPtr<const_unsigned_char>)(auVar65 << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    __kjCondition_21 = 0;
    subReader._reader.data = reader._reader.pointers + 0xe;
    if (reader._reader.pointerCount < 0xf) {
      subReader._reader.data = (WirePointer *)0x0;
    }
    subReader._reader.segment._0_4_ = reader._reader.segment._0_4_;
    subReader._reader.segment._4_4_ = reader._reader.segment._4_4_;
    subReader._reader.capTable._0_4_ = reader._reader.capTable._0_4_;
    subReader._reader.capTable._4_4_ = reader._reader.capTable._4_4_;
    subReader._reader.pointers._0_4_ = reader._reader.nestingLimit;
    if (reader._reader.pointerCount < 0xf) {
      subReader._reader.segment._0_4_ = 0;
      subReader._reader.segment._4_4_ = 0;
      subReader._reader.capTable._0_4_ = 0;
      subReader._reader.capTable._4_4_ = 0;
      subReader._reader.pointers._0_4_ = 0x7fffffff;
    }
    PointerReader::getList
              ((ListReader *)&_kjCondition,(PointerReader *)&subReader,EIGHT_BYTES,(word *)0x0);
    auVar2 = (undefined1  [16])_kjCondition._16_16_;
    subReader._reader.segment._0_1_ = _kjCondition.result;
    subReader._reader.segment._1_3_ = _kjCondition._25_3_;
    _kjCondition._16_16_ = auVar2;
    kj::_::Debug::
    log<char_const(&)[58],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x204,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getFloat64List().size())\", _kjCondition, 0u, reader.getFloat64List().size()"
               ,(char (*) [58])"failed: expected (0u) == (reader.getFloat64List().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_9,
               (uint *)&_kjCondition_21,(uint *)&subReader);
  }
  subReader._reader.data = reader._reader.pointers + 0xf;
  if (reader._reader.pointerCount < 0x10) {
    subReader._reader.data = (WirePointer *)0x0;
  }
  subReader._reader.segment._0_4_ = reader._reader.segment._0_4_;
  subReader._reader.segment._4_4_ = reader._reader.segment._4_4_;
  subReader._reader.capTable._0_4_ = reader._reader.capTable._0_4_;
  subReader._reader.capTable._4_4_ = reader._reader.capTable._4_4_;
  subReader._reader.pointers._0_4_ = reader._reader.nestingLimit;
  if (reader._reader.pointerCount < 0x10) {
    subReader._reader.segment._0_4_ = 0;
    subReader._reader.segment._4_4_ = 0;
    subReader._reader.capTable._0_4_ = 0;
    subReader._reader.capTable._4_4_ = 0;
    subReader._reader.pointers._0_4_ = 0x7fffffff;
  }
  PointerReader::getList
            ((ListReader *)&_kjCondition,(PointerReader *)&subReader,POINTER,(word *)0x0);
  auVar66._4_8_ = " == ";
  auVar66._0_4_ = _kjCondition._24_4_;
  auVar66._12_4_ = 0;
  __kjCondition_9 = (ArrayPtr<const_unsigned_char>)(auVar66 << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    __kjCondition_21 = 0;
    subReader._reader.data = reader._reader.pointers + 0xf;
    if (reader._reader.pointerCount < 0x10) {
      subReader._reader.data = (WirePointer *)0x0;
    }
    subReader._reader.segment._0_4_ = reader._reader.segment._0_4_;
    subReader._reader.segment._4_4_ = reader._reader.segment._4_4_;
    subReader._reader.capTable._0_4_ = reader._reader.capTable._0_4_;
    subReader._reader.capTable._4_4_ = reader._reader.capTable._4_4_;
    subReader._reader.pointers._0_4_ = reader._reader.nestingLimit;
    if (reader._reader.pointerCount < 0x10) {
      subReader._reader.segment._0_4_ = 0;
      subReader._reader.segment._4_4_ = 0;
      subReader._reader.capTable._0_4_ = 0;
      subReader._reader.capTable._4_4_ = 0;
      subReader._reader.pointers._0_4_ = 0x7fffffff;
    }
    PointerReader::getList
              ((ListReader *)&_kjCondition,(PointerReader *)&subReader,POINTER,(word *)0x0);
    auVar2 = (undefined1  [16])_kjCondition._16_16_;
    subReader._reader.segment._0_1_ = _kjCondition.result;
    subReader._reader.segment._1_3_ = _kjCondition._25_3_;
    _kjCondition._16_16_ = auVar2;
    kj::_::Debug::
    log<char_const(&)[55],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x205,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getTextList().size())\", _kjCondition, 0u, reader.getTextList().size()"
               ,(char (*) [55])"failed: expected (0u) == (reader.getTextList().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_9,
               (uint *)&_kjCondition_21,(uint *)&subReader);
  }
  subReader._reader.data = reader._reader.pointers + 0x10;
  if (reader._reader.pointerCount < 0x11) {
    subReader._reader.data = (WirePointer *)0x0;
  }
  subReader._reader.segment._0_4_ = reader._reader.segment._0_4_;
  subReader._reader.segment._4_4_ = reader._reader.segment._4_4_;
  subReader._reader.capTable._0_4_ = reader._reader.capTable._0_4_;
  subReader._reader.capTable._4_4_ = reader._reader.capTable._4_4_;
  subReader._reader.pointers._0_4_ = reader._reader.nestingLimit;
  if (reader._reader.pointerCount < 0x11) {
    subReader._reader.segment._0_4_ = 0;
    subReader._reader.segment._4_4_ = 0;
    subReader._reader.capTable._0_4_ = 0;
    subReader._reader.capTable._4_4_ = 0;
    subReader._reader.pointers._0_4_ = 0x7fffffff;
  }
  PointerReader::getList
            ((ListReader *)&_kjCondition,(PointerReader *)&subReader,POINTER,(word *)0x0);
  auVar67._4_8_ = " == ";
  auVar67._0_4_ = _kjCondition._24_4_;
  auVar67._12_4_ = 0;
  __kjCondition_9 = (ArrayPtr<const_unsigned_char>)(auVar67 << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    __kjCondition_21 = 0;
    subReader._reader.data = reader._reader.pointers + 0x10;
    if (reader._reader.pointerCount < 0x11) {
      subReader._reader.data = (WirePointer *)0x0;
    }
    subReader._reader.segment._0_4_ = reader._reader.segment._0_4_;
    subReader._reader.segment._4_4_ = reader._reader.segment._4_4_;
    subReader._reader.capTable._0_4_ = reader._reader.capTable._0_4_;
    subReader._reader.capTable._4_4_ = reader._reader.capTable._4_4_;
    subReader._reader.pointers._0_4_ = reader._reader.nestingLimit;
    if (reader._reader.pointerCount < 0x11) {
      subReader._reader.segment._0_4_ = 0;
      subReader._reader.segment._4_4_ = 0;
      subReader._reader.capTable._0_4_ = 0;
      subReader._reader.capTable._4_4_ = 0;
      subReader._reader.pointers._0_4_ = 0x7fffffff;
    }
    PointerReader::getList
              ((ListReader *)&_kjCondition,(PointerReader *)&subReader,POINTER,(word *)0x0);
    auVar2 = (undefined1  [16])_kjCondition._16_16_;
    subReader._reader.segment._0_1_ = _kjCondition.result;
    subReader._reader.segment._1_3_ = _kjCondition._25_3_;
    _kjCondition._16_16_ = auVar2;
    kj::_::Debug::
    log<char_const(&)[55],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x206,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getDataList().size())\", _kjCondition, 0u, reader.getDataList().size()"
               ,(char (*) [55])"failed: expected (0u) == (reader.getDataList().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_9,
               (uint *)&_kjCondition_21,(uint *)&subReader);
  }
  subReader._reader.data = reader._reader.pointers + 0x11;
  if (reader._reader.pointerCount < 0x12) {
    subReader._reader.data = (WirePointer *)0x0;
  }
  subReader._reader.segment._0_4_ = reader._reader.segment._0_4_;
  subReader._reader.segment._4_4_ = reader._reader.segment._4_4_;
  subReader._reader.capTable._0_4_ = reader._reader.capTable._0_4_;
  subReader._reader.capTable._4_4_ = reader._reader.capTable._4_4_;
  subReader._reader.pointers._0_4_ = reader._reader.nestingLimit;
  if (reader._reader.pointerCount < 0x12) {
    subReader._reader.segment._0_4_ = 0;
    subReader._reader.segment._4_4_ = 0;
    subReader._reader.capTable._0_4_ = 0;
    subReader._reader.capTable._4_4_ = 0;
    subReader._reader.pointers._0_4_ = 0x7fffffff;
  }
  PointerReader::getList
            ((ListReader *)&_kjCondition,(PointerReader *)&subReader,INLINE_COMPOSITE,(word *)0x0);
  auVar68._4_8_ = " == ";
  auVar68._0_4_ = _kjCondition._24_4_;
  auVar68._12_4_ = 0;
  __kjCondition_9 = (ArrayPtr<const_unsigned_char>)(auVar68 << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar39._12_4_ = 0;
    __kjCondition_21 = (ArrayPtr<const_char>)(auVar39 << 0x20);
    subReader._reader.data = reader._reader.pointers + 0x11;
    if (reader._reader.pointerCount < 0x12) {
      subReader._reader.data = (WirePointer *)0x0;
    }
    if (reader._reader.pointerCount < 0x12) {
      reader._reader.segment._0_4_ = 0;
      reader._reader.segment._4_4_ = 0;
      reader._reader.capTable._0_4_ = 0;
      reader._reader.capTable._4_4_ = 0;
      reader._reader.nestingLimit = 0x7fffffff;
    }
    subReader._reader.segment._4_4_ = reader._reader.segment._4_4_;
    subReader._reader.segment._0_4_ = reader._reader.segment._0_4_;
    subReader._reader.capTable._0_4_ = reader._reader.capTable._0_4_;
    subReader._reader.capTable._4_4_ = reader._reader.capTable._4_4_;
    subReader._reader.pointers._0_4_ = reader._reader.nestingLimit;
    PointerReader::getList
              ((ListReader *)&_kjCondition,(PointerReader *)&subReader,INLINE_COMPOSITE,(word *)0x0)
    ;
    auVar2 = (undefined1  [16])_kjCondition._16_16_;
    subReader._reader.segment._0_1_ = _kjCondition.result;
    subReader._reader.segment._1_3_ = _kjCondition._25_3_;
    _kjCondition._16_16_ = auVar2;
    kj::_::Debug::
    log<char_const(&)[57],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x207,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getStructList().size())\", _kjCondition, 0u, reader.getStructList().size()"
               ,(char (*) [57])"failed: expected (0u) == (reader.getStructList().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_9,
               (uint *)&_kjCondition_21,(uint *)&subReader);
  }
  return;
}

Assistant:

void genericCheckTestMessageAllZero(Reader reader) {
  EXPECT_EQ(VOID, reader.getVoidField());
  EXPECT_EQ(false, reader.getBoolField());
  EXPECT_EQ(0, reader.getInt8Field());
  EXPECT_EQ(0, reader.getInt16Field());
  EXPECT_EQ(0, reader.getInt32Field());
  EXPECT_EQ(0, reader.getInt64Field());
  EXPECT_EQ(0u, reader.getUInt8Field());
  EXPECT_EQ(0u, reader.getUInt16Field());
  EXPECT_EQ(0u, reader.getUInt32Field());
  EXPECT_EQ(0u, reader.getUInt64Field());
  EXPECT_FLOAT_EQ(0, reader.getFloat32Field());
  EXPECT_DOUBLE_EQ(0, reader.getFloat64Field());
  EXPECT_EQ("", reader.getTextField());
  EXPECT_EQ(data(""), reader.getDataField());
  {
    auto subReader = reader.getStructField();
    EXPECT_EQ(VOID, subReader.getVoidField());
    EXPECT_EQ(false, subReader.getBoolField());
    EXPECT_EQ(0, subReader.getInt8Field());
    EXPECT_EQ(0, subReader.getInt16Field());
    EXPECT_EQ(0, subReader.getInt32Field());
    EXPECT_EQ(0, subReader.getInt64Field());
    EXPECT_EQ(0u, subReader.getUInt8Field());
    EXPECT_EQ(0u, subReader.getUInt16Field());
    EXPECT_EQ(0u, subReader.getUInt32Field());
    EXPECT_EQ(0u, subReader.getUInt64Field());
    EXPECT_FLOAT_EQ(0, subReader.getFloat32Field());
    EXPECT_DOUBLE_EQ(0, subReader.getFloat64Field());
    EXPECT_EQ("", subReader.getTextField());
    EXPECT_EQ(data(""), subReader.getDataField());
    {
      auto subSubReader = subReader.getStructField();
      EXPECT_EQ("", subSubReader.getTextField());
      EXPECT_EQ("", subSubReader.getStructField().getTextField());
    }

    EXPECT_EQ(0u, subReader.getVoidList().size());
    EXPECT_EQ(0u, subReader.getBoolList().size());
    EXPECT_EQ(0u, subReader.getInt8List().size());
    EXPECT_EQ(0u, subReader.getInt16List().size());
    EXPECT_EQ(0u, subReader.getInt32List().size());
    EXPECT_EQ(0u, subReader.getInt64List().size());
    EXPECT_EQ(0u, subReader.getUInt8List().size());
    EXPECT_EQ(0u, subReader.getUInt16List().size());
    EXPECT_EQ(0u, subReader.getUInt32List().size());
    EXPECT_EQ(0u, subReader.getUInt64List().size());
    EXPECT_EQ(0u, subReader.getFloat32List().size());
    EXPECT_EQ(0u, subReader.getFloat64List().size());
    EXPECT_EQ(0u, subReader.getTextList().size());
    EXPECT_EQ(0u, subReader.getDataList().size());
    EXPECT_EQ(0u, subReader.getStructList().size());
  }

  EXPECT_EQ(0u, reader.getVoidList().size());
  EXPECT_EQ(0u, reader.getBoolList().size());
  EXPECT_EQ(0u, reader.getInt8List().size());
  EXPECT_EQ(0u, reader.getInt16List().size());
  EXPECT_EQ(0u, reader.getInt32List().size());
  EXPECT_EQ(0u, reader.getInt64List().size());
  EXPECT_EQ(0u, reader.getUInt8List().size());
  EXPECT_EQ(0u, reader.getUInt16List().size());
  EXPECT_EQ(0u, reader.getUInt32List().size());
  EXPECT_EQ(0u, reader.getUInt64List().size());
  EXPECT_EQ(0u, reader.getFloat32List().size());
  EXPECT_EQ(0u, reader.getFloat64List().size());
  EXPECT_EQ(0u, reader.getTextList().size());
  EXPECT_EQ(0u, reader.getDataList().size());
  EXPECT_EQ(0u, reader.getStructList().size());
}